

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents)

{
  anon_struct_8_1_803fbc3e_for_cols aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  emitter_t *peVar18;
  char cVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint64_t uVar23;
  undefined7 in_register_00000011;
  ulong uVar24;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar25;
  emitter_t *peVar26;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar27;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar28;
  char *format;
  undefined7 in_register_00000081;
  uint64_t uVar29;
  emitter_col_t *peVar30;
  long lVar31;
  char *pcVar32;
  emitter_col_t *peVar33;
  emitter_col_t *peVar34;
  emitter_row_t eVar35;
  emitter_row_t eVar36;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar37;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar38;
  bool bVar39;
  size_t sz_43;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_1148;
  emitter_t *local_1140;
  emitter_row_t header_row;
  emitter_row_t row_1;
  uint64_t uptime_s;
  uint64_t uptime;
  uint64_t uptime_s_5;
  size_t sz_57;
  size_t sz_1;
  emitter_type_t local_1100;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_10f8;
  emitter_col_t *local_10f0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_10e8;
  emitter_col_t *local_1080;
  emitter_col_t col_name;
  uint64_t uptime_s_16;
  uint32_t nregs;
  uint nbins;
  size_t miblen_34;
  emitter_type_t local_1028;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_1020;
  emitter_col_t *local_1018;
  emitter_col_t *local_1010;
  size_t curslabs;
  size_t curregs;
  emitter_col_t header_nshards;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t header_ndalloc;
  emitter_col_t col_ndalloc;
  emitter_col_t header_nmalloc_ps;
  emitter_col_t col_nmalloc_ps;
  uint64_t nreslabs;
  uint64_t nflushes;
  uint64_t nfills;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  size_t nonfull_slabs;
  emitter_col_t header_curregs;
  emitter_col_t col_curregs;
  uint nthreads;
  uint32_t nshards;
  emitter_col_t col_curslabs;
  emitter_col_t col_nshards;
  size_t sz_35;
  emitter_type_t local_d78;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_d70;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_d68;
  emitter_col_t *local_d60;
  emitter_col_t col_nmalloc;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t pmuzzy;
  size_t pdirty;
  size_t pactive;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  uint64_t nslabs;
  emitter_col_t header_nmalloc;
  emitter_col_t col_nmalloc_ps_1;
  size_t sz;
  emitter_type_t local_c10;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_c08 [2];
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_bf8;
  undefined4 local_be8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_be0;
  undefined4 local_bc0;
  ulong local_bb8 [4];
  undefined4 local_b98;
  ulong local_b90;
  undefined4 local_b70;
  ulong local_b68 [4];
  undefined4 local_b48;
  ulong local_b40;
  undefined4 local_b20;
  ulong local_b18 [4];
  undefined4 local_af8;
  ulong local_af0;
  undefined4 local_ad0;
  ulong local_ac8 [4];
  undefined4 local_aa8;
  ulong local_aa0;
  undefined4 local_a80;
  undefined1 local_a78 [32];
  emitter_col_t header_curslabs;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests;
  emitter_col_t col_count_ndalloc;
  emitter_col_t col_count_nmalloc;
  emitter_col_t mem_count_val;
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col_count_ndalloc_ps;
  emitter_col_t col_count_nmalloc_ps;
  emitter_col_t col_decay_purged;
  emitter_col_t col_decay_madvises;
  emitter_col_t col_decay_sweeps;
  emitter_col_t col_decay_npages;
  emitter_col_t col_nonfull_slabs;
  emitter_col_t mem_count_title;
  size_t tcache_bytes;
  size_t extent_avail;
  size_t metadata_thp;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t page;
  char *dss;
  size_t slab_size;
  size_t reg_size;
  emitter_col_t header_nonfull_slabs;
  size_t page_1;
  size_t miblen;
  emitter_type_t local_6c0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_6b8;
  emitter_col_t *local_6b0;
  emitter_col_t *local_6a8;
  emitter_row_t row;
  emitter_col_t col_size;
  emitter_col_t header_justify_spacer;
  emitter_col_t local_490;
  emitter_col_t header_nreslabs_ps;
  emitter_col_t col_nreslabs_ps;
  emitter_col_t header_nreslabs;
  emitter_col_t col_nreslabs;
  emitter_col_t header_nslabs;
  emitter_col_t col_nslabs;
  emitter_col_t header_nflushes_ps;
  emitter_col_t col_nflushes_ps;
  emitter_col_t header_nflushes;
  emitter_col_t col_nflushes;
  emitter_col_t header_nfills_ps;
  emitter_col_t col_nfills_ps;
  emitter_col_t header_nfills;
  emitter_col_t col_nfills;
  emitter_col_t header_util;
  emitter_col_t col_util;
  emitter_col_t col_justify_spacer;
  emitter_col_t header_pgs;
  emitter_col_t col_pgs;
  emitter_col_t header_regs;
  emitter_col_t col_regs;
  emitter_col_t col_count_allocated;
  emitter_col_t col_mutex32 [1];
  emitter_col_t col_count_title;
  emitter_col_t header_nmalloc_1;
  emitter_col_t col_decay_type;
  emitter_col_t header_mutex32 [1];
  
  local_1080 = (emitter_col_t *)CONCAT44(local_1080._4_4_,(int)CONCAT71(in_register_00000081,mutex))
  ;
  aVar25.uint64_val._4_4_ = 0;
  aVar25.unsigned_val = i;
  sz = 8;
  local_1140 = emitter;
  iVar20 = je_mallctl("arenas.page",&page,&sz,(void *)0x0,0);
  if (iVar20 != 0) {
LAB_0014a2e4:
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar32 = "arenas.page";
    goto LAB_0014a2d8;
  }
  miblen = 7;
  sz_1 = 4;
  iVar20 = je_mallctlnametomib("stats.arenas.0.nthreads",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.nthreads";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&nthreads,&sz_1,(void *)0x0,0);
  peVar26 = local_1140;
  if (iVar20 != 0) {
LAB_0014a0e4:
    malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_kv_note(local_1140,"nthreads","assigned threads",emitter_type_unsigned,&nthreads,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.uptime",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.uptime";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&uptime,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_kv_note(peVar26,"uptime_ns","uptime",emitter_type_uint64,&uptime,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.dss",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.dss";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&dss,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_kv_note(peVar26,"dss","dss allocation precedence",emitter_type_string,&dss,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.dirty_decay_ms",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.dirty_decay_ms";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&dirty_decay_ms,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.muzzy_decay_ms",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.muzzy_decay_ms";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&muzzy_decay_ms,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.pactive",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.pactive";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&pactive,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.pdirty",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.pdirty";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&pdirty,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.pmuzzy",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.pmuzzy";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&pmuzzy,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.dirty_npurge",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.dirty_npurge";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&dirty_npurge,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.dirty_nmadvise",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.dirty_nmadvise";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&dirty_nmadvise,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.dirty_purged",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.dirty_purged";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&dirty_purged,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.muzzy_npurge",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.muzzy_npurge";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&muzzy_npurge,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.muzzy_nmadvise",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.muzzy_nmadvise";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&muzzy_nmadvise,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.muzzy_purged",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.muzzy_purged";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&muzzy_purged,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"dirty_decay_ms",emitter_type_ssize,&dirty_decay_ms);
  emitter_json_kv(peVar26,"muzzy_decay_ms",emitter_type_ssize,&muzzy_decay_ms);
  emitter_json_kv(peVar26,"pactive",emitter_type_size,&pactive);
  emitter_json_kv(peVar26,"pdirty",emitter_type_size,&pdirty);
  emitter_json_kv(peVar26,"pmuzzy",emitter_type_size,&pmuzzy);
  emitter_json_kv(peVar26,"dirty_npurge",emitter_type_uint64,&dirty_npurge);
  emitter_json_kv(peVar26,"dirty_nmadvise",emitter_type_uint64,&dirty_nmadvise);
  emitter_json_kv(peVar26,"dirty_purged",emitter_type_uint64,&dirty_purged);
  emitter_json_kv(peVar26,"muzzy_npurge",emitter_type_uint64,&muzzy_npurge);
  emitter_json_kv(peVar26,"muzzy_nmadvise",emitter_type_uint64,&muzzy_nmadvise);
  emitter_json_kv(peVar26,"muzzy_purged",emitter_type_uint64,&muzzy_purged);
  local_490.link.qre_next = &col_decay_type;
  col_decay_type.justify = emitter_justify_right;
  col_decay_type.width = 9;
  col_decay_type.type = emitter_type_title;
  col_decay_type.field_3.str_val = "decaying:";
  col_decay_type.link.qre_next = &local_490;
  local_490.justify = emitter_justify_right;
  local_490.width = 6;
  local_490.type = emitter_type_title;
  local_490.field_3.str_val = "time";
  col_decay_npages.link.qre_next = &col_decay_npages;
  col_decay_npages.link.qre_prev = &col_decay_npages;
  col_decay_type.link.qre_prev = col_decay_type.link.qre_next;
  if (local_490.link.qre_next != (emitter_col_t *)0x0) {
    col_decay_npages.link.qre_next = local_490.link.qre_next;
    col_decay_npages.link.qre_prev = col_decay_type.link.qre_next;
    col_decay_type.link.qre_prev = &col_decay_npages;
  }
  col_decay_npages.justify = emitter_justify_right;
  col_decay_npages.width = 0xd;
  col_decay_npages.type = emitter_type_title;
  col_decay_npages.field_3.str_val = "npages";
  col_decay_sweeps.link.qre_next = &col_decay_sweeps;
  col_decay_sweeps.link.qre_prev = &col_decay_sweeps;
  local_490.link.qre_prev = local_490.link.qre_next;
  if (col_decay_npages.link.qre_next != (emitter_col_t *)0x0) {
    col_decay_sweeps.link.qre_prev = ((col_decay_npages.link.qre_next)->link).qre_prev;
    col_decay_sweeps.link.qre_next = col_decay_npages.link.qre_next;
    ((col_decay_sweeps.link.qre_prev)->link).qre_next = &col_decay_sweeps;
    ((col_decay_npages.link.qre_next)->link).qre_prev = &col_decay_sweeps;
  }
  col_decay_sweeps.justify = emitter_justify_right;
  col_decay_sweeps.width = 0xd;
  col_decay_sweeps.type = emitter_type_title;
  col_decay_sweeps.field_3.str_val = "sweeps";
  col_decay_madvises.link.qre_next = &col_decay_madvises;
  col_decay_madvises.link.qre_prev = &col_decay_madvises;
  if (col_decay_sweeps.link.qre_next != (emitter_col_t *)0x0) {
    col_decay_madvises.link.qre_prev = ((col_decay_sweeps.link.qre_next)->link).qre_prev;
    col_decay_madvises.link.qre_next = col_decay_sweeps.link.qre_next;
    ((col_decay_madvises.link.qre_prev)->link).qre_next = &col_decay_madvises;
    ((col_decay_sweeps.link.qre_next)->link).qre_prev = &col_decay_madvises;
  }
  col_decay_madvises.justify = emitter_justify_right;
  col_decay_madvises.width = 0xd;
  col_decay_madvises.type = emitter_type_title;
  col_decay_madvises.field_3.str_val = "madvises";
  col_decay_purged.link.qre_next = &col_decay_purged;
  col_decay_purged.link.qre_prev = &col_decay_purged;
  if (col_decay_madvises.link.qre_next != (emitter_col_t *)0x0) {
    col_decay_purged.link.qre_prev = ((col_decay_madvises.link.qre_next)->link).qre_prev;
    col_decay_purged.link.qre_next = col_decay_madvises.link.qre_next;
    ((col_decay_purged.link.qre_prev)->link).qre_next = &col_decay_purged;
    ((col_decay_madvises.link.qre_next)->link).qre_prev = &col_decay_purged;
  }
  peVar34 = col_decay_purged.link.qre_next;
  col_decay_purged.justify = emitter_justify_right;
  col_decay_purged.width = 0xd;
  col_decay_purged.type = emitter_type_title;
  col_decay_purged.field_3.str_val = "purged";
  local_1148 = aVar25;
  if (peVar26->output == emitter_output_table) {
    if (col_decay_purged.link.qre_next != (emitter_col_t *)0x0) {
      peVar33 = col_decay_purged.link.qre_next;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
  }
  col_decay_type.field_3.str_val = "dirty:";
  if (dirty_decay_ms < 0) {
    local_490.type = emitter_type_title;
    dirty_decay_ms = (ssize_t)"N/A";
  }
  else {
    local_490.type = emitter_type_ssize;
  }
  col_decay_npages.type = emitter_type_size;
  col_decay_npages.field_3.size_val = pdirty;
  col_decay_sweeps.type = emitter_type_uint64;
  col_decay_sweeps.field_3.uint64_val = dirty_npurge;
  col_decay_madvises.type = emitter_type_uint64;
  col_decay_madvises.field_3.uint64_val = dirty_nmadvise;
  col_decay_purged.type = emitter_type_uint64;
  col_decay_purged.field_3.uint64_val = dirty_purged;
  if (peVar26->output == emitter_output_table) {
    local_490.field_3.ssize_val = dirty_decay_ms;
    if (peVar34 != (emitter_col_t *)0x0) {
      peVar33 = peVar34;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
  }
  col_decay_type.field_3.str_val = "muzzy:";
  if (muzzy_decay_ms < 0) {
    local_490.type = emitter_type_title;
    muzzy_decay_ms = (ssize_t)"N/A";
  }
  else {
    local_490.type = emitter_type_ssize;
  }
  col_decay_npages.type = emitter_type_size;
  col_decay_npages.field_3.size_val = pmuzzy;
  col_decay_sweeps.type = emitter_type_uint64;
  col_decay_sweeps.field_3.uint64_val = muzzy_npurge;
  col_decay_madvises.type = emitter_type_uint64;
  col_decay_madvises.field_3.uint64_val = muzzy_nmadvise;
  col_decay_purged.type = emitter_type_uint64;
  col_decay_purged.field_3.uint64_val = muzzy_purged;
  local_490.field_3.ssize_val = muzzy_decay_ms;
  if (peVar26->output == emitter_output_table) {
    if (peVar34 != (emitter_col_t *)0x0) {
      peVar33 = peVar34;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
  }
  peVar26 = local_1140;
  uptime_s_5 = CONCAT44(uptime_s_5._4_4_,(int)CONCAT71(in_register_00000011,bins));
  col_count_allocated.link.qre_prev = &col_count_title;
  col_count_title.justify = emitter_justify_left;
  col_count_title.width = 0x15;
  col_count_title.type = emitter_type_title;
  col_count_title.field_3.str_val = "";
  col_count_title.link.qre_next = &col_count_allocated;
  col_count_allocated.justify = emitter_justify_right;
  col_count_allocated.width = 0x10;
  col_count_allocated.type = emitter_type_title;
  col_count_allocated.field_3.str_val = "allocated";
  col_count_nmalloc.link.qre_next = &col_count_nmalloc;
  col_count_nmalloc.link.qre_prev = &col_count_nmalloc;
  col_count_allocated.link.qre_next = col_count_allocated.link.qre_prev;
  col_count_title.link.qre_prev = col_count_title.link.qre_next;
  if (col_count_allocated.link.qre_prev != (emitter_col_t *)0x0) {
    col_count_nmalloc.link.qre_next = col_count_allocated.link.qre_prev;
    col_count_nmalloc.link.qre_prev = col_count_title.link.qre_next;
    col_count_allocated.link.qre_next = &col_count_nmalloc;
    col_count_title.link.qre_prev = &col_count_nmalloc;
  }
  col_count_nmalloc.justify = emitter_justify_right;
  col_count_nmalloc.width = 0x10;
  col_count_nmalloc.type = emitter_type_title;
  col_count_nmalloc.field_3.str_val = "nmalloc";
  col_count_nmalloc_ps.link.qre_next = &col_count_nmalloc_ps;
  col_count_nmalloc_ps.link.qre_prev = &col_count_nmalloc_ps;
  if (col_count_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nmalloc_ps.link.qre_prev = ((col_count_nmalloc.link.qre_next)->link).qre_prev;
    col_count_nmalloc_ps.link.qre_next = col_count_nmalloc.link.qre_next;
    ((col_count_nmalloc_ps.link.qre_prev)->link).qre_next = &col_count_nmalloc_ps;
    ((col_count_nmalloc.link.qre_next)->link).qre_prev = &col_count_nmalloc_ps;
  }
  col_count_nmalloc_ps.justify = emitter_justify_right;
  col_count_nmalloc_ps.width = 8;
  col_count_nmalloc_ps.type = emitter_type_title;
  col_count_nmalloc_ps.field_3.str_val = "(#/sec)";
  col_count_ndalloc.link.qre_next = &col_count_ndalloc;
  col_count_ndalloc.link.qre_prev = &col_count_ndalloc;
  if (col_count_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_ndalloc.link.qre_prev = ((col_count_nmalloc_ps.link.qre_next)->link).qre_prev;
    col_count_ndalloc.link.qre_next = col_count_nmalloc_ps.link.qre_next;
    ((col_count_ndalloc.link.qre_prev)->link).qre_next = &col_count_ndalloc;
    ((col_count_nmalloc_ps.link.qre_next)->link).qre_prev = &col_count_ndalloc;
  }
  col_count_ndalloc.justify = emitter_justify_right;
  col_count_ndalloc.width = 0x10;
  col_count_ndalloc.type = emitter_type_title;
  col_count_ndalloc.field_3.str_val = "ndalloc";
  col_count_ndalloc_ps.link.qre_next = &col_count_ndalloc_ps;
  col_count_ndalloc_ps.link.qre_prev = &col_count_ndalloc_ps;
  if (col_count_ndalloc.link.qre_next != (emitter_col_t *)0x0) {
    col_count_ndalloc_ps.link.qre_prev = ((col_count_ndalloc.link.qre_next)->link).qre_prev;
    col_count_ndalloc_ps.link.qre_next = col_count_ndalloc.link.qre_next;
    ((col_count_ndalloc_ps.link.qre_prev)->link).qre_next = &col_count_ndalloc_ps;
    ((col_count_ndalloc.link.qre_next)->link).qre_prev = &col_count_ndalloc_ps;
  }
  col_count_ndalloc_ps.justify = emitter_justify_right;
  col_count_ndalloc_ps.width = 8;
  col_count_ndalloc_ps.type = emitter_type_title;
  col_count_ndalloc_ps.field_3.str_val = "(#/sec)";
  col_count_nrequests.link.qre_next = &col_count_nrequests;
  col_count_nrequests.link.qre_prev = &col_count_nrequests;
  if (col_count_ndalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nrequests.link.qre_prev = ((col_count_ndalloc_ps.link.qre_next)->link).qre_prev;
    col_count_nrequests.link.qre_next = col_count_ndalloc_ps.link.qre_next;
    ((col_count_nrequests.link.qre_prev)->link).qre_next = &col_count_nrequests;
    ((col_count_ndalloc_ps.link.qre_next)->link).qre_prev = &col_count_nrequests;
  }
  col_count_nrequests.justify = emitter_justify_right;
  col_count_nrequests.width = 0x10;
  col_count_nrequests.type = emitter_type_title;
  col_count_nrequests.field_3.str_val = "nrequests";
  col_count_nrequests_ps.link.qre_next = &col_count_nrequests_ps;
  col_count_nrequests_ps.link.qre_prev = &col_count_nrequests_ps;
  if (col_count_nrequests.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nrequests_ps.link.qre_prev = ((col_count_nrequests.link.qre_next)->link).qre_prev;
    col_count_nrequests_ps.link.qre_next = col_count_nrequests.link.qre_next;
    ((col_count_nrequests_ps.link.qre_prev)->link).qre_next = &col_count_nrequests_ps;
    ((col_count_nrequests.link.qre_next)->link).qre_prev = &col_count_nrequests_ps;
  }
  col_count_nrequests_ps.justify = emitter_justify_right;
  col_count_nrequests_ps.width = 10;
  col_count_nrequests_ps.type = emitter_type_title;
  col_count_nrequests_ps.field_3.str_val = "(#/sec)";
  col_count_nfills.link.qre_next = &col_count_nfills;
  col_count_nfills.link.qre_prev = &col_count_nfills;
  if (col_count_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nfills.link.qre_prev = ((col_count_nrequests_ps.link.qre_next)->link).qre_prev;
    col_count_nfills.link.qre_next = col_count_nrequests_ps.link.qre_next;
    ((col_count_nfills.link.qre_prev)->link).qre_next = &col_count_nfills;
    ((col_count_nrequests_ps.link.qre_next)->link).qre_prev = &col_count_nfills;
  }
  col_count_nfills.justify = emitter_justify_right;
  col_count_nfills.width = 0x10;
  col_count_nfills.type = emitter_type_title;
  col_count_nfills.field_3.str_val = "nfill";
  col_count_nfills_ps.link.qre_next = &col_count_nfills_ps;
  col_count_nfills_ps.link.qre_prev = &col_count_nfills_ps;
  if (col_count_nfills.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nfills_ps.link.qre_prev = ((col_count_nfills.link.qre_next)->link).qre_prev;
    col_count_nfills_ps.link.qre_next = col_count_nfills.link.qre_next;
    ((col_count_nfills_ps.link.qre_prev)->link).qre_next = &col_count_nfills_ps;
    ((col_count_nfills.link.qre_next)->link).qre_prev = &col_count_nfills_ps;
  }
  col_count_nfills_ps.justify = emitter_justify_right;
  col_count_nfills_ps.width = 10;
  col_count_nfills_ps.type = emitter_type_title;
  col_count_nfills_ps.field_3.str_val = "(#/sec)";
  col_count_nflushes.link.qre_next = &col_count_nflushes;
  col_count_nflushes.link.qre_prev = &col_count_nflushes;
  if (col_count_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nflushes.link.qre_prev = ((col_count_nfills_ps.link.qre_next)->link).qre_prev;
    col_count_nflushes.link.qre_next = col_count_nfills_ps.link.qre_next;
    ((col_count_nflushes.link.qre_prev)->link).qre_next = &col_count_nflushes;
    ((col_count_nfills_ps.link.qre_next)->link).qre_prev = &col_count_nflushes;
  }
  col_count_nflushes.justify = emitter_justify_right;
  col_count_nflushes.width = 0x10;
  col_count_nflushes.type = emitter_type_title;
  col_count_nflushes.field_3.str_val = "nflush";
  col_count_nflushes_ps.link.qre_next = &col_count_nflushes_ps;
  col_count_nflushes_ps.link.qre_prev = &col_count_nflushes_ps;
  if (col_count_nflushes.link.qre_next != (emitter_col_t *)0x0) {
    col_count_nflushes_ps.link.qre_prev = ((col_count_nflushes.link.qre_next)->link).qre_prev;
    col_count_nflushes_ps.link.qre_next = col_count_nflushes.link.qre_next;
    ((col_count_nflushes_ps.link.qre_prev)->link).qre_next = &col_count_nflushes_ps;
    ((col_count_nflushes.link.qre_next)->link).qre_prev = &col_count_nflushes_ps;
  }
  peVar34 = col_count_nflushes_ps.link.qre_next;
  col_count_nflushes_ps.justify = emitter_justify_right;
  col_count_nflushes_ps.width = 10;
  col_count_nflushes_ps.type = emitter_type_title;
  col_count_nflushes_ps.field_3.str_val = "(#/sec)";
  if (local_1140->output == emitter_output_table) {
    if (col_count_nflushes_ps.link.qre_next != (emitter_col_t *)0x0) {
      peVar33 = col_count_nflushes_ps.link.qre_next;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
  }
  aVar25 = local_1148;
  col_count_nmalloc_ps.type = emitter_type_uint64;
  col_count_ndalloc_ps.type = emitter_type_uint64;
  col_count_nrequests_ps.type = emitter_type_uint64;
  col_count_nfills_ps.type = emitter_type_uint64;
  col_count_nflushes_ps.type = emitter_type_uint64;
  emitter_json_object_kv_begin(peVar26,"small");
  col_count_title.field_3.str_val = "small:";
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.allocated",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.allocated";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_allocated,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"allocated",emitter_type_size,&small_allocated);
  col_count_allocated.type = emitter_type_size;
  col_count_allocated.field_3.size_val = small_allocated;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.nmalloc",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.nmalloc";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_nmalloc,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nmalloc",emitter_type_uint64,&small_nmalloc);
  col_count_nmalloc.type = emitter_type_uint64;
  col_count_nmalloc.field_3.uint64_val = small_nmalloc;
  if (small_nmalloc == 0 || uptime == 0) {
    col_count_nmalloc_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nmalloc_ps.field_3.uint64_val = small_nmalloc;
    if (999999999 < uptime) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = small_nmalloc;
      col_count_nmalloc_ps.field_3.uint64_val =
           SUB168(auVar3 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.ndalloc",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.ndalloc";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_ndalloc,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"ndalloc",emitter_type_uint64,&small_ndalloc);
  col_count_ndalloc.type = emitter_type_uint64;
  col_count_ndalloc.field_3.uint64_val = small_ndalloc;
  if (small_ndalloc == 0 || uptime == 0) {
    col_count_ndalloc_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_ndalloc_ps.field_3.uint64_val = small_ndalloc;
    if (999999999 < uptime) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = small_ndalloc;
      col_count_ndalloc_ps.field_3.uint64_val =
           SUB168(auVar4 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.nrequests",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.nrequests";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_nrequests,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nrequests",emitter_type_uint64,&small_nrequests);
  col_count_nrequests.type = emitter_type_uint64;
  col_count_nrequests.field_3.uint64_val = small_nrequests;
  if (small_nrequests == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nrequests_ps.field_3.uint64_val = small_nrequests;
    if (999999999 < uptime) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = small_nrequests;
      col_count_nrequests_ps.field_3.uint64_val =
           SUB168(auVar5 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.nfills",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.nfills";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_nfills,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nfills",emitter_type_uint64,&small_nfills);
  col_count_nfills.type = emitter_type_uint64;
  col_count_nfills.field_3.uint64_val = small_nfills;
  if (small_nfills == 0 || uptime == 0) {
    col_count_nfills_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nfills_ps.field_3.uint64_val = small_nfills;
    if (999999999 < uptime) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = small_nfills;
      col_count_nfills_ps.field_3.uint64_val =
           SUB168(auVar6 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.small.nflushes",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.small.nflushes";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&small_nflushes,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nflushes",emitter_type_uint64,&small_nflushes);
  peVar26 = local_1140;
  col_count_nflushes.type = emitter_type_uint64;
  col_count_nflushes.field_3.uint64_val = small_nflushes;
  if (small_nflushes == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nflushes_ps.field_3.uint64_val = small_nflushes;
    if (999999999 < uptime) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = small_nflushes;
      col_count_nflushes_ps.field_3.uint64_val =
           SUB168(auVar7 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  if (local_1140->output == emitter_output_table) {
    if (peVar34 != (emitter_col_t *)0x0) {
      peVar33 = peVar34;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  if (peVar26->output == emitter_output_json) {
    peVar26->nesting_depth = peVar26->nesting_depth + -1;
    peVar26->item_at_depth = true;
    emitter_printf(peVar26,"\n");
    pcVar32 = "\t";
    if (peVar26->output != emitter_output_json) {
      pcVar32 = " ";
    }
    if (0 < peVar26->nesting_depth) {
      iVar21 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
      iVar20 = 1;
      if (1 < iVar21) {
        iVar20 = iVar21;
      }
      do {
        emitter_printf(peVar26,"%s",pcVar32);
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    emitter_printf(peVar26,"}");
    aVar25 = local_1148;
  }
  emitter_json_object_kv_begin(peVar26,"large");
  col_count_title.field_3.str_val = "large:";
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.allocated",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.allocated";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_allocated,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"allocated",emitter_type_size,&large_allocated);
  col_count_allocated.type = emitter_type_size;
  col_count_allocated.field_3.size_val = large_allocated;
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.nmalloc",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.nmalloc";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_nmalloc,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nmalloc",emitter_type_uint64,&large_nmalloc);
  col_count_nmalloc.type = emitter_type_uint64;
  col_count_nmalloc.field_3.uint64_val = large_nmalloc;
  if (large_nmalloc == 0 || uptime == 0) {
    col_count_nmalloc_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nmalloc_ps.field_3.uint64_val = large_nmalloc;
    if (999999999 < uptime) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = large_nmalloc;
      col_count_nmalloc_ps.field_3.uint64_val =
           SUB168(auVar8 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.ndalloc",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.ndalloc";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_ndalloc,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"ndalloc",emitter_type_uint64,&large_ndalloc);
  col_count_ndalloc.type = emitter_type_uint64;
  col_count_ndalloc.field_3.uint64_val = large_ndalloc;
  if (large_ndalloc == 0 || uptime == 0) {
    col_count_ndalloc_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_ndalloc_ps.field_3.uint64_val = large_ndalloc;
    if (999999999 < uptime) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = large_ndalloc;
      col_count_ndalloc_ps.field_3.uint64_val =
           SUB168(auVar9 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                           (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.nrequests",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.nrequests";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_nrequests,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nrequests",emitter_type_uint64,&large_nrequests);
  col_count_nrequests.type = emitter_type_uint64;
  col_count_nrequests.field_3.uint64_val = large_nrequests;
  if (large_nrequests == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nrequests_ps.field_3.uint64_val = large_nrequests;
    if (999999999 < uptime) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = large_nrequests;
      col_count_nrequests_ps.field_3.uint64_val =
           SUB168(auVar10 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                            (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.nfills",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.nfills";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_nfills,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nfills",emitter_type_uint64,&large_nfills);
  col_count_nfills.type = emitter_type_uint64;
  col_count_nfills.field_3.uint64_val = large_nfills;
  if (large_nfills == 0 || uptime == 0) {
    col_count_nfills_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nfills_ps.field_3.uint64_val = large_nfills;
    if (999999999 < uptime) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = large_nfills;
      col_count_nfills_ps.field_3.uint64_val =
           SUB168(auVar11 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                            (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.large.nflushes",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.large.nflushes";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&large_nflushes,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(local_1140,"nflushes",emitter_type_uint64,&large_nflushes);
  peVar26 = local_1140;
  col_count_nflushes.type = emitter_type_uint64;
  col_count_nflushes.field_3.uint64_val = large_nflushes;
  if (large_nflushes == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else {
    col_count_nflushes_ps.field_3.uint64_val = large_nflushes;
    if (999999999 < uptime) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = large_nflushes;
      col_count_nflushes_ps.field_3.uint64_val =
           SUB168(auVar12 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                            (undefined1  [16])0x1fffffffffffff),0);
    }
  }
  if (local_1140->output == emitter_output_table) {
    if (peVar34 != (emitter_col_t *)0x0) {
      peVar33 = peVar34;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  peVar18 = local_1140;
  if (peVar26->output == emitter_output_json) {
    local_1140->nesting_depth = local_1140->nesting_depth + -1;
    local_1140->item_at_depth = true;
    emitter_printf(local_1140,"\n");
    pcVar32 = "\t";
    if (peVar18->output != emitter_output_json) {
      pcVar32 = " ";
    }
    if (0 < peVar18->nesting_depth) {
      iVar21 = peVar18->nesting_depth << (peVar18->output != emitter_output_json);
      iVar20 = 1;
      if (1 < iVar21) {
        iVar20 = iVar21;
      }
      do {
        emitter_printf(peVar18,"%s",pcVar32);
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    emitter_printf(peVar18,"}");
    aVar25 = local_1148;
  }
  peVar26 = local_1140;
  col_count_ndalloc_ps.field_3.str_val = (char *)(large_ndalloc + small_ndalloc);
  col_count_title.field_3.str_val = "total:";
  col_count_nrequests_ps.field_3.str_val = (char *)(large_nrequests + small_nrequests);
  col_count_allocated.field_3.str_val = (char *)(large_allocated + small_allocated);
  col_count_nfills_ps.field_3.str_val = (char *)(large_nfills + small_nfills);
  col_count_nflushes_ps.field_3.str_val = (char *)(large_nflushes + small_nflushes);
  col_count_nmalloc_ps.field_3.str_val = (char *)(large_nmalloc + small_nmalloc);
  col_count_nmalloc.field_3 = col_count_nmalloc_ps.field_3;
  col_count_ndalloc.field_3 = col_count_ndalloc_ps.field_3;
  col_count_nrequests.field_3.uint64_val = (uint64_t)col_count_nrequests_ps.field_3;
  col_count_nfills.field_3.uint64_val = (uint64_t)col_count_nfills_ps.field_3;
  col_count_nflushes.field_3 = col_count_nflushes_ps.field_3;
  if (uptime == 0 || col_count_nmalloc_ps.field_3.uint64_val == 0) {
    col_count_nmalloc_ps.field_3.uint64_val = 0;
  }
  else if (999999999 < uptime) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = col_count_nmalloc_ps.field_3.uint64_val;
    col_count_nmalloc_ps.field_3.uint64_val =
         SUB168(auVar13 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                          (undefined1  [16])0x1fffffffffffff),0);
  }
  if (col_count_ndalloc_ps.field_3.uint64_val == 0 || uptime == 0) {
    col_count_ndalloc_ps.field_3.uint64_val = 0;
  }
  else if (999999999 < uptime) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = col_count_ndalloc_ps.field_3.uint64_val;
    col_count_ndalloc_ps.field_3.uint64_val =
         SUB168(auVar14 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                          (undefined1  [16])0x1fffffffffffff),0);
  }
  if (col_count_nrequests_ps.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nrequests_ps.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
  }
  else if (999999999 < uptime) {
    col_count_nrequests_ps.field_3.uint64_val =
         col_count_nrequests_ps.field_3.uint64_val / (uptime / 1000000000);
  }
  if (col_count_nfills_ps.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nfills_ps.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
  }
  else if (999999999 < uptime) {
    col_count_nfills_ps.field_3.uint64_val =
         col_count_nfills_ps.field_3.uint64_val / (uptime / 1000000000);
  }
  if (col_count_nflushes_ps.field_3.uint64_val == 0 || uptime == 0) {
    col_count_nflushes_ps.field_3.uint64_val = 0;
  }
  else if (999999999 < uptime) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = col_count_nflushes_ps.field_3.uint64_val;
    col_count_nflushes_ps.field_3.uint64_val =
         SUB168(auVar15 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                          (undefined1  [16])0x1fffffffffffff),0);
  }
  if (local_1140->output == emitter_output_table) {
    if (peVar34 != (emitter_col_t *)0x0) {
      peVar33 = peVar34;
      do {
        emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,&peVar33->field_3)
        ;
        peVar33 = (peVar33->link).qre_next;
        if (peVar33 == peVar34) {
          peVar33 = (emitter_col_t *)0x0;
        }
      } while (peVar33 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  mem_count_title.justify = emitter_justify_left;
  mem_count_title.width = 0x15;
  mem_count_title.type = emitter_type_title;
  mem_count_title.field_3.str_val = "";
  mem_count_val.link.qre_prev = &mem_count_title;
  mem_count_val.link.qre_next = &mem_count_title;
  mem_count_title.link.qre_next = &mem_count_val;
  mem_count_title.link.qre_prev = &mem_count_val;
  mem_count_val.justify = emitter_justify_right;
  mem_count_val.width = 0x10;
  mem_count_val.type = emitter_type_title;
  mem_count_val.field_3.str_val = "";
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  mem_count_val.type = emitter_type_size;
  mem_count_title.field_3.str_val = "active:";
  mem_count_val.field_3.uint64_val = page * pactive;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.mapped",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.mapped";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&mapped,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"mapped",emitter_type_size,&mapped);
  mem_count_title.field_3.str_val = "mapped:";
  mem_count_val.field_3.size_val = mapped;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.retained",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.retained";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&retained,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"retained",emitter_type_size,&retained);
  mem_count_title.field_3.str_val = "retained:";
  mem_count_val.field_3.size_val = retained;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.base",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.base";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&base,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"base",emitter_type_size,&base);
  mem_count_title.field_3.str_val = "base:";
  mem_count_val.field_3.size_val = base;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.internal",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.internal";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&internal,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"internal",emitter_type_size,&internal);
  mem_count_title.field_3.str_val = "internal:";
  mem_count_val.field_3.size_val = internal;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.metadata_thp",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.metadata_thp";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&metadata_thp,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"metadata_thp",emitter_type_size,&metadata_thp);
  mem_count_title.field_3.str_val = "metadata_thp:";
  mem_count_val.field_3.size_val = metadata_thp;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.tcache_bytes",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.tcache_bytes";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&tcache_bytes,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"tcache_bytes",emitter_type_size,&tcache_bytes);
  mem_count_title.field_3.str_val = "tcache_bytes:";
  mem_count_val.field_3.size_val = tcache_bytes;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.resident",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.resident";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&resident,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"resident",emitter_type_size,&resident);
  mem_count_title.field_3.str_val = "resident:";
  mem_count_val.field_3.size_val = resident;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  miblen = 7;
  sz_1 = 8;
  iVar20 = je_mallctlnametomib("stats.arenas.0.extent_avail",&sz,&miblen);
  if (iVar20 != 0) {
    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
    pcVar32 = "stats.arenas.0.extent_avail";
    goto LAB_0014a2d8;
  }
  local_c08[0] = aVar25;
  iVar20 = je_mallctlbymib(&sz,miblen,&extent_avail,&sz_1,(void *)0x0,0);
  if (iVar20 != 0) goto LAB_0014a0e4;
  emitter_json_kv(peVar26,"extent_avail",emitter_type_size,&extent_avail);
  mem_count_title.field_3.str_val = "extent_avail:";
  mem_count_val.field_3.size_val = extent_avail;
  if (peVar26->output == emitter_output_table) {
    if (&mem_count_title != (emitter_col_t *)0x0) {
      peVar34 = &mem_count_title;
      do {
        emitter_print_value(peVar26,peVar34->justify,peVar34->width,peVar34->type,&peVar34->field_3)
        ;
        peVar34 = (peVar34->link).qre_next;
        if (peVar34 == &mem_count_title) {
          peVar34 = (emitter_col_t *)0x0;
        }
      } while (peVar34 != (emitter_col_t *)0x0);
    }
    emitter_table_printf(peVar26,"\n");
    aVar25 = local_1148;
  }
  uVar23 = uptime;
  if ((char)local_1080 != '\0') {
    row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
    mutex_stats_init_cols(&row,"",&col_name,(emitter_col_t *)&sz,&col_size);
    emitter_json_object_kv_begin(peVar26,"mutexes");
    aVar25 = local_1148;
    eVar35 = row;
    if (peVar26->output == emitter_output_table) {
      while (eVar35.cols.qlh_first != (emitter_col_t *)0x0) {
        emitter_print_value(local_1140,((emitter_col_t *)eVar35.cols.qlh_first)->justify,
                            ((emitter_col_t *)eVar35.cols.qlh_first)->width,
                            ((emitter_col_t *)eVar35.cols.qlh_first)->type,
                            &((emitter_col_t *)eVar35.cols.qlh_first)->field_3);
        eVar35.cols.qlh_first =
             (anon_struct_8_1_803fbc3e_for_cols)
             (((emitter_col_t *)eVar35.cols.qlh_first)->link).qre_next;
        if (eVar35.cols.qlh_first == row.cols.qlh_first) {
          eVar35.cols.qlh_first =
               (anon_struct_8_1_803fbc3e_for_cols)
               (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
        }
      }
      emitter_table_printf(local_1140,"\n");
    }
    uVar24 = uVar23 / 1000000000;
    lVar31 = 0;
    do {
      aVar37 = *(anon_union_8_10_2a69db89_for_emitter_col_s_3 *)(arena_mutex_names + lVar31);
      emitter_json_object_kv_begin(local_1140,aVar37.str_val);
      local_c10 = emitter_type_uint64;
      col_name.field_3 = aVar37;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) {
LAB_0014a0f5:
        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar32 = (char *)&miblen;
        goto LAB_0014a2d8;
      }
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_c08,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      local_be8 = 4;
      local_be0 = local_c08[0];
      if (uVar23 == 0) {
        local_be0.uint64_val = 0;
      }
      if ((emitter_col_t *)local_c08[0].uint64_val != (emitter_col_t *)0x0 && 999999999 < uVar23) {
        local_be0.uint64_val = local_c08[0].uint64_val / uVar24;
      }
      local_bc0 = 4;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_bb8,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      local_b98 = 4;
      local_b90 = local_bb8[0];
      if (uVar23 == 0) {
        local_b90 = 0;
      }
      if (local_bb8[0] != 0 && 999999999 < uVar23) {
        local_b90 = local_bb8[0] / uVar24;
      }
      local_b70 = 4;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_b68,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      local_b48 = 4;
      local_b40 = local_b68[0];
      if (uVar23 == 0) {
        local_b40 = 0;
      }
      if (local_b68[0] != 0 && 999999999 < uVar23) {
        local_b40 = local_b68[0] / uVar24;
      }
      local_b20 = 4;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_b18,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      local_af8 = 4;
      local_af0 = local_b18[0];
      if (uVar23 == 0) {
        local_af0 = 0;
      }
      if (local_b18[0] != 0 && 999999999 < uVar23) {
        local_af0 = local_b18[0] / uVar24;
      }
      local_ad0 = 4;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_ac8,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      local_aa8 = 4;
      local_aa0 = local_ac8[0];
      if (uVar23 == 0) {
        local_aa0 = 0;
      }
      if (local_ac8[0] != 0 && 999999999 < uVar23) {
        local_aa0 = local_ac8[0] / uVar24;
      }
      local_a80 = 4;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 8;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,local_a78,&sz_35,(void *)0x0,0);
      if (iVar20 != 0) goto LAB_0014a0e4;
      col_size.type = emitter_type_uint32;
      malloc_snprintf((char *)&miblen,0x80,"stats.%s.%s.%s","arenas.0.mutexes");
      miblen_34 = 7;
      sz_35 = 4;
      iVar20 = je_mallctlnametomib((char *)&miblen,&sz_1,&miblen_34);
      if (iVar20 != 0) goto LAB_0014a0f5;
      local_10f8 = aVar25;
      iVar20 = je_mallctlbymib(&sz_1,miblen_34,&col_size.field_3,&sz_35,(void *)0x0,0);
      peVar26 = local_1140;
      if (iVar20 != 0) goto LAB_0014a0e4;
      mutex_stats_emit(local_1140,&row,(emitter_col_t *)&sz,&col_size);
      peVar18 = local_1140;
      if (peVar26->output == emitter_output_json) {
        local_1140->nesting_depth = local_1140->nesting_depth + -1;
        local_1140->item_at_depth = true;
        emitter_printf(local_1140,"\n");
        pcVar32 = "\t";
        if (peVar18->output != emitter_output_json) {
          pcVar32 = " ";
        }
        if (0 < peVar18->nesting_depth) {
          iVar20 = peVar18->nesting_depth << (peVar18->output != emitter_output_json);
          if (iVar20 < 2) {
            iVar20 = 1;
          }
          do {
            emitter_printf(peVar18,"%s",pcVar32);
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
        }
        emitter_printf(peVar18,"}");
      }
      peVar26 = local_1140;
      lVar31 = lVar31 + 1;
      aVar25 = local_1148;
    } while (lVar31 != 9);
    if (local_1140->output == emitter_output_json) {
      local_1140->nesting_depth = local_1140->nesting_depth + -1;
      local_1140->item_at_depth = true;
      emitter_printf(local_1140,"\n");
      pcVar32 = "\t";
      if (peVar26->output != emitter_output_json) {
        pcVar32 = " ";
      }
      if (0 < peVar26->nesting_depth) {
        iVar21 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
        iVar20 = 1;
        if (1 < iVar21) {
          iVar20 = iVar21;
        }
        do {
          emitter_printf(peVar26,"%s",pcVar32);
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
      emitter_printf(peVar26,"}");
      aVar25 = local_1148;
    }
  }
  uVar23 = uptime;
  if ((char)uptime_s_5 == '\0') {
LAB_0014876f:
    if (!large) {
LAB_00149441:
      col_size.link.qre_prev = (emitter_col_t *)&sz_1;
      if (extents) {
        col_name.link.qre_prev = (emitter_col_t *)&miblen;
        miblen = 0x1400000001;
        local_6c0 = emitter_type_size;
        local_1100 = emitter_type_title;
        local_10f8.str_val = "size";
        local_1010 = &col_name;
        col_name.justify = emitter_justify_right;
        col_name.width = 4;
        col_name.type = emitter_type_unsigned;
        local_10f0 = &col_size;
        col_size.justify = emitter_justify_right;
        col_size.width = 4;
        col_size.type = emitter_type_title;
        col_size.field_3.str_val = "ind";
        col_name.link.qre_next = (emitter_col_t *)&miblen_34;
        miblen_34 = 0xd00000001;
        local_1028 = emitter_type_size;
        col_size.link.qre_next = (emitter_col_t *)&sz_35;
        sz_35 = 0xd00000001;
        local_d78 = emitter_type_title;
        local_d70.str_val = "ndirty";
        local_1018 = (emitter_col_t *)&row;
        row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0xd00000001;
        local_d68.str_val = (char *)&header_nmalloc_1;
        header_nmalloc_1.justify = emitter_justify_right;
        header_nmalloc_1.width = 0xd;
        header_nmalloc_1.type = emitter_type_title;
        header_nmalloc_1.field_3.str_val = "dirty";
        col_nmalloc_ps_1.link.qre_next = &col_nmalloc_ps_1;
        col_nmalloc_ps_1.link.qre_prev = &col_nmalloc_ps_1;
        local_6a8 = local_1018;
        if (col_name.link.qre_prev != (emitter_col_t *)0x0) {
          col_nmalloc_ps_1.link.qre_next = col_name.link.qre_prev;
          col_nmalloc_ps_1.link.qre_prev = local_1018;
          local_6a8 = &col_nmalloc_ps_1;
        }
        col_nmalloc_ps_1.justify = emitter_justify_right;
        col_nmalloc_ps_1.width = 0xd;
        col_nmalloc_ps_1.type = emitter_type_size;
        local_10e8.str_val = local_d68.str_val;
        col_nmalloc.link.qre_next = &col_nmalloc;
        col_nmalloc.link.qre_prev = &col_nmalloc;
        header_nmalloc_1.link.qre_next = col_size.link.qre_prev;
        if (col_size.link.qre_prev != (emitter_col_t *)0x0) {
          local_10e8.str_val = (char *)&col_nmalloc;
          col_nmalloc.link.qre_next = col_size.link.qre_prev;
          col_nmalloc.link.qre_prev = (emitter_col_t *)local_d68.str_val;
          header_nmalloc_1.link.qre_next = &col_nmalloc;
        }
        col_nmalloc.justify = emitter_justify_right;
        col_nmalloc.width = 0xd;
        col_nmalloc.type = emitter_type_title;
        col_nmalloc.field_3.str_val = "nmuzzy";
        header_nmalloc.link.qre_next = &header_nmalloc;
        header_nmalloc.link.qre_prev = &header_nmalloc;
        local_6b0 = local_1010;
        if (col_nmalloc_ps_1.link.qre_next != (emitter_col_t *)0x0) {
          header_nmalloc.link.qre_prev = ((col_nmalloc_ps_1.link.qre_next)->link).qre_prev;
          header_nmalloc.link.qre_next = col_nmalloc_ps_1.link.qre_next;
          ((header_nmalloc.link.qre_prev)->link).qre_next = &header_nmalloc;
          ((col_nmalloc_ps_1.link.qre_next)->link).qre_prev = &header_nmalloc;
        }
        header_nmalloc.justify = emitter_justify_right;
        header_nmalloc.width = 0xd;
        header_nmalloc.type = emitter_type_size;
        col_nmalloc_ps.link.qre_next = &col_nmalloc_ps;
        col_nmalloc_ps.link.qre_prev = &col_nmalloc_ps;
        local_d60 = local_10f0;
        if (col_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
          col_nmalloc_ps.link.qre_prev = ((col_nmalloc.link.qre_next)->link).qre_prev;
          col_nmalloc_ps.link.qre_next = col_nmalloc.link.qre_next;
          ((col_nmalloc_ps.link.qre_prev)->link).qre_next = &col_nmalloc_ps;
          ((col_nmalloc.link.qre_next)->link).qre_prev = &col_nmalloc_ps;
        }
        col_nmalloc_ps.justify = emitter_justify_right;
        col_nmalloc_ps.width = 0xd;
        col_nmalloc_ps.type = emitter_type_title;
        col_nmalloc_ps.field_3.str_val = "muzzy";
        header_nmalloc_ps.link.qre_next = &header_nmalloc_ps;
        header_nmalloc_ps.link.qre_prev = &header_nmalloc_ps;
        if (header_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
          header_nmalloc_ps.link.qre_prev = ((header_nmalloc.link.qre_next)->link).qre_prev;
          header_nmalloc_ps.link.qre_next = header_nmalloc.link.qre_next;
          ((header_nmalloc_ps.link.qre_prev)->link).qre_next = &header_nmalloc_ps;
          ((header_nmalloc.link.qre_next)->link).qre_prev = &header_nmalloc_ps;
        }
        peVar34 = header_nmalloc_ps.link.qre_next;
        header_nmalloc_ps.justify = emitter_justify_right;
        header_nmalloc_ps.width = 0xd;
        header_nmalloc_ps.type = emitter_type_size;
        col_ndalloc.link.qre_next = &col_ndalloc;
        col_ndalloc.link.qre_prev = &col_ndalloc;
        if (col_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
          col_ndalloc.link.qre_prev = ((col_nmalloc_ps.link.qre_next)->link).qre_prev;
          col_ndalloc.link.qre_next = col_nmalloc_ps.link.qre_next;
          ((col_ndalloc.link.qre_prev)->link).qre_next = &col_ndalloc;
          ((col_nmalloc_ps.link.qre_next)->link).qre_prev = &col_ndalloc;
        }
        col_ndalloc.justify = emitter_justify_right;
        col_ndalloc.width = 0xd;
        col_ndalloc.type = emitter_type_title;
        col_ndalloc.field_3.str_val = "nretained";
        header_ndalloc.link.qre_next = &header_ndalloc;
        header_ndalloc.link.qre_prev = &header_ndalloc;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_ndalloc.link.qre_prev = (peVar34->link).qre_prev;
          header_ndalloc.link.qre_next = peVar34;
          ((header_ndalloc.link.qre_prev)->link).qre_next = &header_ndalloc;
          (peVar34->link).qre_prev = &header_ndalloc;
        }
        peVar34 = header_ndalloc.link.qre_next;
        header_ndalloc.justify = emitter_justify_right;
        header_ndalloc.width = 0xd;
        header_ndalloc.type = emitter_type_size;
        col_ndalloc_ps.link.qre_next = &col_ndalloc_ps;
        col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
        if (col_ndalloc.link.qre_next != (emitter_col_t *)0x0) {
          col_ndalloc_ps.link.qre_prev = ((col_ndalloc.link.qre_next)->link).qre_prev;
          col_ndalloc_ps.link.qre_next = col_ndalloc.link.qre_next;
          ((col_ndalloc_ps.link.qre_prev)->link).qre_next = &col_ndalloc_ps;
          ((col_ndalloc.link.qre_next)->link).qre_prev = &col_ndalloc_ps;
        }
        col_ndalloc_ps.justify = emitter_justify_right;
        col_ndalloc_ps.width = 0xd;
        col_ndalloc_ps.type = emitter_type_title;
        col_ndalloc_ps.field_3.str_val = "retained";
        header_ndalloc_ps.link.qre_next = &header_ndalloc_ps;
        header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_ndalloc_ps.link.qre_prev = (peVar34->link).qre_prev;
          header_ndalloc_ps.link.qre_next = peVar34;
          ((header_ndalloc_ps.link.qre_prev)->link).qre_next = &header_ndalloc_ps;
          (peVar34->link).qre_prev = &header_ndalloc_ps;
        }
        peVar34 = header_ndalloc_ps.link.qre_next;
        header_ndalloc_ps.justify = emitter_justify_right;
        header_ndalloc_ps.width = 0xd;
        header_ndalloc_ps.type = emitter_type_size;
        col_nrequests.link.qre_next = &col_nrequests;
        col_nrequests.link.qre_prev = &col_nrequests;
        if (col_ndalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
          col_nrequests.link.qre_prev = ((col_ndalloc_ps.link.qre_next)->link).qre_prev;
          col_nrequests.link.qre_next = col_ndalloc_ps.link.qre_next;
          ((col_nrequests.link.qre_prev)->link).qre_next = &col_nrequests;
          ((col_ndalloc_ps.link.qre_next)->link).qre_prev = &col_nrequests;
        }
        col_nrequests.justify = emitter_justify_right;
        col_nrequests.width = 0xd;
        col_nrequests.type = emitter_type_title;
        col_nrequests.field_3.str_val = "ntotal";
        header_nrequests.link.qre_next = &header_nrequests;
        header_nrequests.link.qre_prev = &header_nrequests;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_nrequests.link.qre_prev = (peVar34->link).qre_prev;
          header_nrequests.link.qre_next = peVar34;
          ((header_nrequests.link.qre_prev)->link).qre_next = &header_nrequests;
          (peVar34->link).qre_prev = &header_nrequests;
        }
        peVar34 = header_nrequests.link.qre_next;
        header_nrequests.justify = emitter_justify_right;
        header_nrequests.width = 0xd;
        header_nrequests.type = emitter_type_size;
        col_nrequests_ps.link.qre_next = &col_nrequests_ps;
        col_nrequests_ps.link.qre_prev = &col_nrequests_ps;
        if (col_nrequests.link.qre_next != (emitter_col_t *)0x0) {
          col_nrequests_ps.link.qre_prev = ((col_nrequests.link.qre_next)->link).qre_prev;
          col_nrequests_ps.link.qre_next = col_nrequests.link.qre_next;
          ((col_nrequests_ps.link.qre_prev)->link).qre_next = &col_nrequests_ps;
          ((col_nrequests.link.qre_next)->link).qre_prev = &col_nrequests_ps;
        }
        peVar33 = col_nrequests_ps.link.qre_next;
        col_nrequests_ps.justify = emitter_justify_right;
        col_nrequests_ps.width = 0xd;
        col_nrequests_ps.type = emitter_type_title;
        col_nrequests_ps.field_3.str_val = "total";
        sz_1 = 0xc00000001;
        header_nmalloc_1.link.qre_prev = col_size.link.qre_next;
        emitter_table_printf(peVar26,"extents:");
        if (peVar26->output == emitter_output_table) {
          if (peVar33 != (emitter_col_t *)0x0) {
            peVar30 = peVar33;
            do {
              emitter_print_value(peVar26,peVar30->justify,peVar30->width,peVar30->type,
                                  &peVar30->field_3);
              peVar30 = (peVar30->link).qre_next;
              if (peVar30 == peVar33) {
                peVar30 = (emitter_col_t *)0x0;
              }
            } while (peVar30 != (emitter_col_t *)0x0);
          }
          emitter_table_printf(peVar26,"\n");
          aVar25 = local_1148;
        }
        emitter_json_array_kv_begin(peVar26,"extents");
        aVar37.uint64_val = 0;
        local_1080 = peVar34;
        bVar39 = false;
        do {
          col_nshards.justify = 7;
          col_nshards.width = 0;
          header_nshards.justify = 8;
          header_nshards.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.ndirty",&sz,(size_t *)&col_nshards)
          ;
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.ndirty";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,col_nshards._0_8_,&header_nrequests_ps,
                                   (size_t *)&header_nshards,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          header_nshards.justify = 7;
          header_nshards.width = 0;
          col_curregs.justify = 8;
          col_curregs.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.nmuzzy",&sz,
                                       (size_t *)&header_nshards);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.nmuzzy";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,header_nshards._0_8_,&col_nshards,(size_t *)&col_curregs,
                                   (void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_curregs.justify = 7;
          col_curregs.width = 0;
          header_curregs.justify = 8;
          header_curregs.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.nretained",&sz,
                                       (size_t *)&col_curregs);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.nretained";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,col_curregs._0_8_,&header_nshards,(size_t *)&header_curregs,
                                   (void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          header_curregs.justify = 7;
          header_curregs.width = 0;
          col_curslabs.justify = 8;
          col_curslabs.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.dirty_bytes",&sz,
                                       (size_t *)&header_curregs);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.dirty_bytes";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,header_curregs._0_8_,&col_curregs,(size_t *)&col_curslabs,
                                   (void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_curslabs.justify = 7;
          col_curslabs.width = 0;
          header_curslabs.justify = 8;
          header_curslabs.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.muzzy_bytes",&sz,
                                       (size_t *)&col_curslabs);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.muzzy_bytes";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,col_curslabs._0_8_,&header_curregs,(size_t *)&header_curslabs
                                   ,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          header_curslabs.justify = 7;
          header_curslabs.width = 0;
          col_nonfull_slabs.justify = 8;
          col_nonfull_slabs.width = 0;
          iVar20 = je_mallctlnametomib("stats.arenas.0.extents.0.retained_bytes",&sz,
                                       (size_t *)&header_curslabs);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.extents.0.retained_bytes";
            goto LAB_0014a2d8;
          }
          local_c08[0] = aVar25;
          local_bf8 = aVar37;
          iVar20 = je_mallctlbymib(&sz,header_curslabs._0_8_,&col_curslabs,
                                   (size_t *)&col_nonfull_slabs,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          aVar38.str_val = (char *)(header_curregs._0_8_ + col_curregs._0_8_ + col_curslabs._0_8_);
          aVar27.str_val =
               (char *)(col_nshards._0_8_ + header_nrequests_ps._0_8_ + header_nshards._0_8_);
          if (bVar39 == true && aVar27.uint64_val != 0) {
            emitter_table_printf(local_1140,"                     ---\n");
          }
          peVar26 = local_1140;
          aVar28.str_val = aVar27.str_val;
          if (local_1140->output == emitter_output_json) {
            uptime_s_5 = (uint64_t)aVar27.str_val;
            if (local_1140->emitted_key == true) {
              local_1140->emitted_key = false;
            }
            else {
              pcVar32 = "";
              if (local_1140->item_at_depth != false) {
                pcVar32 = ",";
              }
              emitter_printf(local_1140,"%s\n",pcVar32);
              pcVar32 = "\t";
              if (peVar26->output != emitter_output_json) {
                pcVar32 = " ";
              }
              if (0 < peVar26->nesting_depth) {
                iVar20 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
                if (iVar20 < 2) {
                  iVar20 = 1;
                }
                do {
                  emitter_printf(peVar26,"%s",pcVar32);
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
            }
            emitter_printf(peVar26,"{");
            peVar26->nesting_depth = peVar26->nesting_depth + 1;
            peVar26->item_at_depth = false;
            aVar25 = local_1148;
            aVar28.uint64_val = uptime_s_5;
          }
          emitter_json_kv(peVar26,"ndirty",emitter_type_size,&header_nrequests_ps);
          emitter_json_kv(peVar26,"nmuzzy",emitter_type_size,&col_nshards);
          emitter_json_kv(peVar26,"nretained",emitter_type_size,&header_nshards);
          emitter_json_kv(peVar26,"dirty_bytes",emitter_type_size,&col_curregs);
          emitter_json_kv(peVar26,"muzzy_bytes",emitter_type_size,&header_curregs);
          emitter_json_kv(peVar26,"retained_bytes",emitter_type_size,&col_curslabs);
          peVar18 = local_1140;
          if (peVar26->output == emitter_output_json) {
            local_1140->nesting_depth = local_1140->nesting_depth + -1;
            local_1140->item_at_depth = true;
            uptime_s_5 = aVar28.uint64_val;
            emitter_printf(local_1140,"\n");
            pcVar32 = "\t";
            if (peVar18->output != emitter_output_json) {
              pcVar32 = " ";
            }
            if (0 < peVar18->nesting_depth) {
              iVar20 = peVar18->nesting_depth << (peVar18->output != emitter_output_json);
              if (iVar20 < 2) {
                iVar20 = 1;
              }
              do {
                emitter_printf(peVar18,"%s",pcVar32);
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            emitter_printf(peVar18,"}");
            aVar25 = local_1148;
            aVar28.uint64_val = uptime_s_5;
          }
          peVar34 = local_1080;
          peVar26 = local_1140;
          local_6b8 = *(anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                       (sz_pind2sz_tab + aVar37.uint64_val);
          local_1020 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_nrequests_ps._0_8_;
          col_nmalloc_ps_1.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_nshards._0_8_
          ;
          header_nmalloc.field_3 =
               (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_curregs._0_8_;
          header_nmalloc_ps.field_3 =
               (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_nshards._0_8_;
          header_ndalloc.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_curslabs._0_8_;
          col_name.field_3 = aVar37;
          header_nrequests.field_3.str_val = aVar38.str_val;
          header_ndalloc_ps.field_3 = aVar28;
          if ((aVar28.uint64_val != 0) &&
             (peVar33 = local_1080, local_1140->output == emitter_output_table)) {
            while (peVar33 != (emitter_col_t *)0x0) {
              emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,
                                  &peVar33->field_3);
              peVar30 = (peVar33->link).qre_next;
              peVar33 = (emitter_col_t *)0x0;
              if (peVar30 != peVar34) {
                peVar33 = peVar30;
              }
            }
            emitter_table_printf(peVar26,"\n");
            aVar25 = local_1148;
          }
          peVar26 = local_1140;
          aVar37.str_val = (char *)(aVar37.uint64_val + 1);
          bVar39 = aVar27.uint64_val == 0;
        } while (aVar37.uint64_val != 199);
        if (local_1140->output == emitter_output_json) {
          local_1140->nesting_depth = local_1140->nesting_depth + -1;
          local_1140->item_at_depth = true;
          emitter_printf(local_1140,"\n");
          pcVar32 = "\t";
          if (peVar26->output != emitter_output_json) {
            pcVar32 = " ";
          }
          if (0 < peVar26->nesting_depth) {
            iVar21 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
            iVar20 = 1;
            if (1 < iVar21) {
              iVar20 = iVar21;
            }
            do {
              emitter_printf(peVar26,"%s",pcVar32);
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          emitter_printf(peVar26,"]");
        }
        if (aVar28.uint64_val == 0) {
          emitter_table_printf(local_1140,"                     ---\n");
        }
      }
      return;
    }
    sz = 4;
    iVar20 = je_mallctl("arenas.nbins",&col_nonfull_slabs,&sz,(void *)0x0,0);
    if (iVar20 == 0) {
      sz = 4;
      iVar20 = je_mallctl("arenas.nlextents",&header_nonfull_slabs,&sz,(void *)0x0,0);
      if (iVar20 == 0) {
        col_name.link.qre_prev = (emitter_col_t *)&miblen;
        miblen = 0x1400000001;
        local_6c0 = emitter_type_size;
        local_1100 = emitter_type_title;
        local_10f8.str_val = "size";
        local_1010 = &col_name;
        col_name.justify = emitter_justify_right;
        col_name.width = 4;
        col_name.type = emitter_type_unsigned;
        local_10f0 = &col_size;
        col_size.justify = emitter_justify_right;
        col_size.width = 4;
        col_size.type = emitter_type_title;
        col_size.field_3.str_val = "ind";
        col_name.link.qre_next = (emitter_col_t *)&miblen_34;
        miblen_34 = 0xd00000001;
        local_1028 = emitter_type_size;
        col_size.link.qre_next = (emitter_col_t *)&sz_35;
        sz_35 = 0xd00000001;
        local_d78 = emitter_type_title;
        local_d70.str_val = "allocated";
        local_1018 = (emitter_col_t *)&row;
        row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0xd00000001;
        local_d68.str_val = (char *)&header_nmalloc_1;
        header_nmalloc_1.justify = emitter_justify_right;
        header_nmalloc_1.width = 0xd;
        header_nmalloc_1.type = emitter_type_title;
        header_nmalloc_1.field_3.str_val = "nmalloc";
        col_nmalloc_ps_1.link.qre_next = &col_nmalloc_ps_1;
        col_nmalloc_ps_1.link.qre_prev = &col_nmalloc_ps_1;
        local_6a8 = local_1018;
        if (col_name.link.qre_prev != (emitter_col_t *)0x0) {
          col_nmalloc_ps_1.link.qre_next = col_name.link.qre_prev;
          col_nmalloc_ps_1.link.qre_prev = local_1018;
          local_6a8 = &col_nmalloc_ps_1;
        }
        col_nmalloc_ps_1.justify = emitter_justify_right;
        col_nmalloc_ps_1.width = 8;
        col_nmalloc_ps_1.type = emitter_type_uint64;
        local_10e8.str_val = local_d68.str_val;
        col_nmalloc.link.qre_next = &col_nmalloc;
        col_nmalloc.link.qre_prev = &col_nmalloc;
        header_nmalloc_1.link.qre_next = (emitter_col_t *)&sz_1;
        if ((emitter_col_t *)&sz_1 != (emitter_col_t *)0x0) {
          local_10e8.str_val = (char *)&col_nmalloc;
          col_nmalloc.link.qre_next = (emitter_col_t *)&sz_1;
          col_nmalloc.link.qre_prev = (emitter_col_t *)local_d68.str_val;
          header_nmalloc_1.link.qre_next = &col_nmalloc;
        }
        col_nmalloc.justify = emitter_justify_right;
        col_nmalloc.width = 8;
        col_nmalloc.type = emitter_type_title;
        col_nmalloc.field_3.str_val = "(#/sec)";
        header_nmalloc.link.qre_next = &header_nmalloc;
        header_nmalloc.link.qre_prev = &header_nmalloc;
        local_6b0 = local_1010;
        if (col_nmalloc_ps_1.link.qre_next != (emitter_col_t *)0x0) {
          header_nmalloc.link.qre_prev = ((col_nmalloc_ps_1.link.qre_next)->link).qre_prev;
          header_nmalloc.link.qre_next = col_nmalloc_ps_1.link.qre_next;
          ((header_nmalloc.link.qre_prev)->link).qre_next = &header_nmalloc;
          ((col_nmalloc_ps_1.link.qre_next)->link).qre_prev = &header_nmalloc;
        }
        header_nmalloc.justify = emitter_justify_right;
        header_nmalloc.width = 0xd;
        header_nmalloc.type = emitter_type_uint64;
        col_nmalloc_ps.link.qre_next = &col_nmalloc_ps;
        col_nmalloc_ps.link.qre_prev = &col_nmalloc_ps;
        local_d60 = local_10f0;
        if (col_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
          col_nmalloc_ps.link.qre_prev = ((col_nmalloc.link.qre_next)->link).qre_prev;
          col_nmalloc_ps.link.qre_next = col_nmalloc.link.qre_next;
          ((col_nmalloc_ps.link.qre_prev)->link).qre_next = &col_nmalloc_ps;
          ((col_nmalloc.link.qre_next)->link).qre_prev = &col_nmalloc_ps;
        }
        col_nmalloc_ps.justify = emitter_justify_right;
        col_nmalloc_ps.width = 0xd;
        col_nmalloc_ps.type = emitter_type_title;
        col_nmalloc_ps.field_3.str_val = "ndalloc";
        header_nmalloc_ps.link.qre_next = &header_nmalloc_ps;
        header_nmalloc_ps.link.qre_prev = &header_nmalloc_ps;
        if (header_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
          header_nmalloc_ps.link.qre_prev = ((header_nmalloc.link.qre_next)->link).qre_prev;
          header_nmalloc_ps.link.qre_next = header_nmalloc.link.qre_next;
          ((header_nmalloc_ps.link.qre_prev)->link).qre_next = &header_nmalloc_ps;
          ((header_nmalloc.link.qre_next)->link).qre_prev = &header_nmalloc_ps;
        }
        peVar34 = header_nmalloc_ps.link.qre_next;
        header_nmalloc_ps.justify = emitter_justify_right;
        header_nmalloc_ps.width = 8;
        header_nmalloc_ps.type = emitter_type_uint64;
        col_ndalloc.link.qre_next = &col_ndalloc;
        col_ndalloc.link.qre_prev = &col_ndalloc;
        if (col_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
          col_ndalloc.link.qre_prev = ((col_nmalloc_ps.link.qre_next)->link).qre_prev;
          col_ndalloc.link.qre_next = col_nmalloc_ps.link.qre_next;
          ((col_ndalloc.link.qre_prev)->link).qre_next = &col_ndalloc;
          ((col_nmalloc_ps.link.qre_next)->link).qre_prev = &col_ndalloc;
        }
        col_ndalloc.justify = emitter_justify_right;
        col_ndalloc.width = 8;
        col_ndalloc.type = emitter_type_title;
        col_ndalloc.field_3.str_val = "(#/sec)";
        header_ndalloc.link.qre_next = &header_ndalloc;
        header_ndalloc.link.qre_prev = &header_ndalloc;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_ndalloc.link.qre_prev = (peVar34->link).qre_prev;
          header_ndalloc.link.qre_next = peVar34;
          ((header_ndalloc.link.qre_prev)->link).qre_next = &header_ndalloc;
          (peVar34->link).qre_prev = &header_ndalloc;
        }
        peVar34 = header_ndalloc.link.qre_next;
        header_ndalloc.justify = emitter_justify_right;
        header_ndalloc.width = 0xd;
        header_ndalloc.type = emitter_type_uint64;
        col_ndalloc_ps.link.qre_next = &col_ndalloc_ps;
        col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
        if (col_ndalloc.link.qre_next != (emitter_col_t *)0x0) {
          col_ndalloc_ps.link.qre_prev = ((col_ndalloc.link.qre_next)->link).qre_prev;
          col_ndalloc_ps.link.qre_next = col_ndalloc.link.qre_next;
          ((col_ndalloc_ps.link.qre_prev)->link).qre_next = &col_ndalloc_ps;
          ((col_ndalloc.link.qre_next)->link).qre_prev = &col_ndalloc_ps;
        }
        col_ndalloc_ps.justify = emitter_justify_right;
        col_ndalloc_ps.width = 0xd;
        col_ndalloc_ps.type = emitter_type_title;
        col_ndalloc_ps.field_3.str_val = "nrequests";
        header_ndalloc_ps.link.qre_next = &header_ndalloc_ps;
        header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_ndalloc_ps.link.qre_prev = (peVar34->link).qre_prev;
          header_ndalloc_ps.link.qre_next = peVar34;
          ((header_ndalloc_ps.link.qre_prev)->link).qre_next = &header_ndalloc_ps;
          (peVar34->link).qre_prev = &header_ndalloc_ps;
        }
        peVar34 = header_ndalloc_ps.link.qre_next;
        header_ndalloc_ps.justify = emitter_justify_right;
        header_ndalloc_ps.width = 8;
        header_ndalloc_ps.type = emitter_type_uint64;
        col_nrequests.link.qre_next = &col_nrequests;
        col_nrequests.link.qre_prev = &col_nrequests;
        if (col_ndalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
          col_nrequests.link.qre_prev = ((col_ndalloc_ps.link.qre_next)->link).qre_prev;
          col_nrequests.link.qre_next = col_ndalloc_ps.link.qre_next;
          ((col_nrequests.link.qre_prev)->link).qre_next = &col_nrequests;
          ((col_ndalloc_ps.link.qre_next)->link).qre_prev = &col_nrequests;
        }
        col_nrequests.justify = emitter_justify_right;
        col_nrequests.width = 8;
        col_nrequests.type = emitter_type_title;
        col_nrequests.field_3.str_val = "(#/sec)";
        header_nrequests.link.qre_next = &header_nrequests;
        header_nrequests.link.qre_prev = &header_nrequests;
        if (peVar34 != (emitter_col_t *)0x0) {
          header_nrequests.link.qre_prev = (peVar34->link).qre_prev;
          header_nrequests.link.qre_next = peVar34;
          ((header_nrequests.link.qre_prev)->link).qre_next = &header_nrequests;
          (peVar34->link).qre_prev = &header_nrequests;
        }
        peVar34 = header_nrequests.link.qre_next;
        header_nrequests.justify = emitter_justify_right;
        header_nrequests.width = 0xd;
        header_nrequests.type = emitter_type_size;
        col_nrequests_ps.link.qre_next = &col_nrequests_ps;
        col_nrequests_ps.link.qre_prev = &col_nrequests_ps;
        if (col_nrequests.link.qre_next != (emitter_col_t *)0x0) {
          col_nrequests_ps.link.qre_prev = ((col_nrequests.link.qre_next)->link).qre_prev;
          col_nrequests_ps.link.qre_next = col_nrequests.link.qre_next;
          ((col_nrequests_ps.link.qre_prev)->link).qre_next = &col_nrequests_ps;
          ((col_nrequests.link.qre_next)->link).qre_prev = &col_nrequests_ps;
        }
        peVar33 = col_nrequests_ps.link.qre_next;
        col_nrequests_ps.justify = emitter_justify_right;
        col_nrequests_ps.width = 0xd;
        col_nrequests_ps.type = emitter_type_title;
        col_nrequests_ps.field_3.str_val = "curlextents";
        sz_1 = 0xe00000001;
        col_size.link.qre_prev = (emitter_col_t *)&sz_1;
        header_nmalloc_1.link.qre_prev = col_size.link.qre_next;
        emitter_table_printf(peVar26,"large:");
        if (peVar26->output == emitter_output_table) {
          if (peVar33 != (emitter_col_t *)0x0) {
            peVar30 = peVar33;
            do {
              emitter_print_value(peVar26,peVar30->justify,peVar30->width,peVar30->type,
                                  &peVar30->field_3);
              peVar30 = (peVar30->link).qre_next;
              if (peVar30 == peVar33) {
                peVar30 = (emitter_col_t *)0x0;
              }
            } while (peVar30 != (emitter_col_t *)0x0);
          }
          emitter_table_printf(peVar26,"\n");
          aVar25 = local_1148;
        }
        emitter_json_array_kv_begin(peVar26,"lextents");
        if (header_nonfull_slabs.justify == emitter_justify_left) {
          cVar19 = '\0';
        }
        else {
          uVar24 = uptime / 1000000000;
          uptime_s = 0;
          uVar23 = 0;
          do {
            col_nshards.justify = 7;
            col_nshards.width = 0;
            header_nshards.justify = 8;
            header_nshards.width = 0;
            iVar20 = je_mallctlnametomib("stats.arenas.0.lextents.0.nmalloc",&sz,
                                         (size_t *)&col_nshards);
            if (iVar20 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar32 = "stats.arenas.0.lextents.0.nmalloc";
              goto LAB_0014a2d8;
            }
            local_c08[0] = local_1148;
            local_bf8.uint64_val = uptime_s;
            iVar20 = je_mallctlbymib(&sz,col_nshards._0_8_,&header_nrequests_ps,
                                     (size_t *)&header_nshards,(void *)0x0,0);
            if (iVar20 != 0) goto LAB_0014a0e4;
            header_nshards.justify = 7;
            header_nshards.width = 0;
            col_curregs.justify = 8;
            col_curregs.width = 0;
            iVar20 = je_mallctlnametomib("stats.arenas.0.lextents.0.ndalloc",&sz,
                                         (size_t *)&header_nshards);
            if (iVar20 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar32 = "stats.arenas.0.lextents.0.ndalloc";
              goto LAB_0014a2d8;
            }
            local_c08[0] = local_1148;
            local_bf8.uint64_val = uptime_s;
            iVar20 = je_mallctlbymib(&sz,header_nshards._0_8_,&col_nshards,(size_t *)&col_curregs,
                                     (void *)0x0,0);
            if (iVar20 != 0) goto LAB_0014a0e4;
            col_curregs.justify = 7;
            col_curregs.width = 0;
            header_curregs.justify = 8;
            header_curregs.width = 0;
            iVar20 = je_mallctlnametomib("stats.arenas.0.lextents.0.nrequests",&sz,
                                         (size_t *)&col_curregs);
            if (iVar20 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar32 = "stats.arenas.0.lextents.0.nrequests";
              goto LAB_0014a2d8;
            }
            local_c08[0] = local_1148;
            local_bf8.uint64_val = uptime_s;
            iVar20 = je_mallctlbymib(&sz,col_curregs._0_8_,&header_nshards,(size_t *)&header_curregs
                                     ,(void *)0x0,0);
            peVar26 = local_1140;
            if (iVar20 != 0) goto LAB_0014a0e4;
            local_1080 = (emitter_col_t *)header_nshards._0_8_;
            uptime_s_5 = CONCAT71(header_nshards._1_7_,header_nshards._0_8_ == 0);
            if ((~(byte)uVar23 & 1) == 0 && header_nshards._0_8_ != 0) {
              emitter_table_printf(local_1140,"                     ---\n");
            }
            header_curregs.justify = 7;
            header_curregs.width = 0;
            col_curslabs.justify = 8;
            col_curslabs.width = 0;
            iVar20 = je_mallctlnametomib("arenas.lextent.0.size",&sz,(size_t *)&header_curregs);
            if (iVar20 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar32 = "arenas.lextent.0.size";
              goto LAB_0014a2d8;
            }
            local_c08[0].uint64_val = uptime_s;
            iVar20 = je_mallctlbymib(&sz,header_curregs._0_8_,&col_curregs,(size_t *)&col_curslabs,
                                     (void *)0x0,0);
            if (iVar20 != 0) goto LAB_0014a0e4;
            col_curslabs.justify = 7;
            col_curslabs.width = 0;
            header_curslabs.justify = 8;
            header_curslabs.width = 0;
            iVar20 = je_mallctlnametomib("stats.arenas.0.lextents.0.curlextents",&sz,
                                         (size_t *)&col_curslabs);
            if (iVar20 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar32 = "stats.arenas.0.lextents.0.curlextents";
              goto LAB_0014a2d8;
            }
            local_c08[0] = local_1148;
            local_bf8.uint64_val = uptime_s;
            iVar20 = je_mallctlbymib(&sz,col_curslabs._0_8_,&header_curregs,
                                     (size_t *)&header_curslabs,(void *)0x0,0);
            if (iVar20 != 0) goto LAB_0014a0e4;
            if (peVar26->output == emitter_output_json) {
              if (peVar26->emitted_key == true) {
                peVar26->emitted_key = false;
              }
              else {
                pcVar32 = "";
                if (peVar26->item_at_depth != false) {
                  pcVar32 = ",";
                }
                emitter_printf(peVar26,"%s\n",pcVar32);
                pcVar32 = "\t";
                if (peVar26->output != emitter_output_json) {
                  pcVar32 = " ";
                }
                if (0 < peVar26->nesting_depth) {
                  iVar20 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
                  if (iVar20 < 2) {
                    iVar20 = 1;
                  }
                  do {
                    emitter_printf(peVar26,"%s",pcVar32);
                    iVar20 = iVar20 + -1;
                  } while (iVar20 != 0);
                }
              }
              emitter_printf(peVar26,"{");
              peVar26->nesting_depth = peVar26->nesting_depth + 1;
              peVar26->item_at_depth = false;
            }
            aVar25 = local_1148;
            emitter_json_kv(peVar26,"curlextents",emitter_type_size,&header_curregs);
            if (peVar26->output == emitter_output_json) {
              peVar26->nesting_depth = peVar26->nesting_depth + -1;
              peVar26->item_at_depth = true;
              emitter_printf(peVar26,"\n");
              pcVar32 = "\t";
              if (peVar26->output != emitter_output_json) {
                pcVar32 = " ";
              }
              if (0 < peVar26->nesting_depth) {
                iVar20 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
                if (iVar20 < 2) {
                  iVar20 = 1;
                }
                do {
                  emitter_printf(peVar26,"%s",pcVar32);
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              emitter_printf(peVar26,"}");
              aVar25 = local_1148;
            }
            local_1020.uint64_val = header_curregs._0_8_ * col_curregs._0_8_;
            local_6b8 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_curregs._0_8_;
            col_name.field_3.int_val = col_nonfull_slabs.justify + (int)uptime_s;
            col_nmalloc_ps_1.field_3 =
                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_nrequests_ps._0_8_;
            if (uptime == 0) {
              col_nmalloc_ps_1.field_3.uint64_val = 0;
            }
            if (header_nrequests_ps._0_8_ != 0 && 999999999 < uptime) {
              col_nmalloc_ps_1.field_3.uint64_val = (ulong)header_nrequests_ps._0_8_ / uVar24;
            }
            header_nmalloc.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_nshards._0_8_
            ;
            header_nmalloc_ps.field_3 =
                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)col_nshards._0_8_;
            if (uptime == 0) {
              header_nmalloc_ps.field_3.uint64_val = 0;
            }
            if (col_nshards._0_8_ != 0 && 999999999 < uptime) {
              header_nmalloc_ps.field_3.uint64_val = (ulong)col_nshards._0_8_ / uVar24;
            }
            header_ndalloc.field_3 =
                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_nshards._0_8_;
            header_ndalloc_ps.field_3 =
                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_nshards._0_8_;
            if (uptime == 0) {
              header_ndalloc_ps.field_3.uint64_val = 0;
            }
            if (header_nshards._0_8_ != 0 && 999999999 < uptime) {
              header_ndalloc_ps.field_3.uint64_val = (ulong)header_nshards._0_8_ / uVar24;
            }
            header_nrequests.field_3 =
                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)header_curregs._0_8_;
            if ((local_1080 != (emitter_col_t *)0x0) &&
               (peVar33 = peVar34, peVar26->output == emitter_output_table)) {
              while (peVar33 != (emitter_col_t *)0x0) {
                emitter_print_value(peVar26,peVar33->justify,peVar33->width,peVar33->type,
                                    &peVar33->field_3);
                peVar30 = (peVar33->link).qre_next;
                peVar33 = (emitter_col_t *)0x0;
                if (peVar30 != peVar34) {
                  peVar33 = peVar30;
                }
              }
              emitter_table_printf(peVar26,"\n");
              aVar25 = local_1148;
            }
            uptime_s = uptime_s + 1;
            cVar19 = (char)uptime_s_5;
            uVar23 = uptime_s_5;
          } while (uptime_s < (header_nonfull_slabs._0_8_ & 0xffffffff));
        }
        if (peVar26->output == emitter_output_json) {
          peVar26->nesting_depth = peVar26->nesting_depth + -1;
          peVar26->item_at_depth = true;
          emitter_printf(peVar26,"\n");
          pcVar32 = "\t";
          if (peVar26->output != emitter_output_json) {
            pcVar32 = " ";
          }
          if (0 < peVar26->nesting_depth) {
            iVar21 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
            iVar20 = 1;
            if (1 < iVar21) {
              iVar20 = iVar21;
            }
            do {
              emitter_printf(peVar26,"%s",pcVar32);
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          emitter_printf(peVar26,"]");
          aVar25 = local_1148;
        }
        if (cVar19 != '\0') {
          emitter_table_printf(peVar26,"                     ---\n");
        }
        goto LAB_00149441;
      }
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar32 = "arenas.nlextents";
      goto LAB_0014a2d8;
    }
  }
  else {
    sz = 8;
    iVar20 = je_mallctl("arenas.page",&page_1,&sz,(void *)0x0,0);
    if (iVar20 != 0) goto LAB_0014a2e4;
    sz = 4;
    iVar20 = je_mallctl("arenas.nbins",&nbins,&sz,(void *)0x0,0);
    if (iVar20 == 0) {
      local_d60 = &col_size;
      col_size.justify = emitter_justify_right;
      col_size.width = 0x14;
      col_size.type = emitter_type_size;
      header_nmalloc.link.qre_next = (emitter_col_t *)&miblen_34;
      miblen_34 = 0x1400000001;
      local_1028 = emitter_type_title;
      local_1020.str_val = "size";
      header_nmalloc_1.link.qre_prev = (emitter_col_t *)&sz_35;
      sz_35 = 0x400000001;
      local_d78 = emitter_type_unsigned;
      local_1018 = (emitter_col_t *)&row;
      row.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x400000001;
      local_d68.str_val = (char *)&header_nmalloc_1;
      header_nmalloc_1.justify = emitter_justify_right;
      header_nmalloc_1.width = 0xd;
      header_nmalloc_1.type = emitter_type_uint64;
      header_nmalloc.link.qre_prev = &col_nmalloc_ps_1;
      col_nmalloc_ps_1.justify = emitter_justify_right;
      col_nmalloc_ps_1.width = 0xd;
      col_nmalloc_ps_1.type = emitter_type_title;
      col_nmalloc_ps_1.field_3.str_val = "allocated";
      header_nmalloc_1.link.qre_next = &col_nmalloc;
      col_nmalloc.justify = emitter_justify_right;
      col_nmalloc.width = 0xd;
      col_nmalloc.type = emitter_type_uint64;
      col_nmalloc_ps_1.link.qre_next = &header_nmalloc;
      header_nmalloc.justify = emitter_justify_right;
      header_nmalloc.width = 0xd;
      header_nmalloc.type = emitter_type_title;
      header_nmalloc.field_3.str_val = "nmalloc";
      col_nmalloc_ps.link.qre_next = &col_nmalloc_ps;
      col_nmalloc_ps.link.qre_prev = &col_nmalloc_ps;
      col_nmalloc.link.qre_next = local_d60;
      col_size.link.qre_prev = header_nmalloc_1.link.qre_next;
      if (local_d60 != (emitter_col_t *)0x0) {
        col_nmalloc_ps.link.qre_next = local_d60;
        col_nmalloc_ps.link.qre_prev = header_nmalloc_1.link.qre_next;
        col_nmalloc.link.qre_next = &col_nmalloc_ps;
        col_size.link.qre_prev = &col_nmalloc_ps;
      }
      col_nmalloc_ps.justify = emitter_justify_right;
      col_nmalloc_ps.width = 8;
      col_nmalloc_ps.type = emitter_type_uint64;
      local_1010 = col_nmalloc_ps_1.link.qre_next;
      header_nmalloc_ps.link.qre_next = &header_nmalloc_ps;
      header_nmalloc_ps.link.qre_prev = &header_nmalloc_ps;
      if (header_nmalloc.link.qre_next != (emitter_col_t *)0x0) {
        local_1010 = &header_nmalloc_ps;
        header_nmalloc_ps.link.qre_next = header_nmalloc.link.qre_next;
        header_nmalloc_ps.link.qre_prev = col_nmalloc_ps_1.link.qre_next;
      }
      header_nmalloc_ps.justify = emitter_justify_right;
      header_nmalloc_ps.width = 8;
      header_nmalloc_ps.type = emitter_type_title;
      header_nmalloc_ps.field_3.str_val = "(#/sec)";
      col_ndalloc.link.qre_next = &col_ndalloc;
      col_ndalloc.link.qre_prev = &col_ndalloc;
      col_nmalloc.link.qre_prev = (emitter_col_t *)local_d68.str_val;
      col_nmalloc_ps_1.link.qre_prev = local_1018;
      col_size.link.qre_next = header_nmalloc_1.link.qre_prev;
      if (col_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_ndalloc.link.qre_prev = ((col_nmalloc_ps.link.qre_next)->link).qre_prev;
        col_ndalloc.link.qre_next = col_nmalloc_ps.link.qre_next;
        ((col_ndalloc.link.qre_prev)->link).qre_next = &col_ndalloc;
        ((col_nmalloc_ps.link.qre_next)->link).qre_prev = &col_ndalloc;
      }
      peVar34 = col_ndalloc.link.qre_next;
      col_ndalloc.justify = emitter_justify_right;
      col_ndalloc.width = 0xd;
      col_ndalloc.type = emitter_type_uint64;
      header_ndalloc.link.qre_next = &header_ndalloc;
      header_ndalloc.link.qre_prev = &header_ndalloc;
      if (header_nmalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_ndalloc.link.qre_prev = ((header_nmalloc_ps.link.qre_next)->link).qre_prev;
        header_ndalloc.link.qre_next = header_nmalloc_ps.link.qre_next;
        ((header_ndalloc.link.qre_prev)->link).qre_next = &header_ndalloc;
        ((header_nmalloc_ps.link.qre_next)->link).qre_prev = &header_ndalloc;
      }
      header_ndalloc.justify = emitter_justify_right;
      header_ndalloc.width = 0xd;
      header_ndalloc.type = emitter_type_title;
      header_ndalloc.field_3.str_val = "ndalloc";
      col_ndalloc_ps.link.qre_next = &col_ndalloc_ps;
      col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_ndalloc_ps.link.qre_prev = (peVar34->link).qre_prev;
        col_ndalloc_ps.link.qre_next = peVar34;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_next = &col_ndalloc_ps;
        (peVar34->link).qre_prev = &col_ndalloc_ps;
      }
      peVar34 = col_ndalloc_ps.link.qre_next;
      col_ndalloc_ps.justify = emitter_justify_right;
      col_ndalloc_ps.width = 8;
      col_ndalloc_ps.type = emitter_type_uint64;
      header_ndalloc_ps.link.qre_next = &header_ndalloc_ps;
      header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
      if (header_ndalloc.link.qre_next != (emitter_col_t *)0x0) {
        header_ndalloc_ps.link.qre_prev = ((header_ndalloc.link.qre_next)->link).qre_prev;
        header_ndalloc_ps.link.qre_next = header_ndalloc.link.qre_next;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_next = &header_ndalloc_ps;
        ((header_ndalloc.link.qre_next)->link).qre_prev = &header_ndalloc_ps;
      }
      header_ndalloc_ps.justify = emitter_justify_right;
      header_ndalloc_ps.width = 8;
      header_ndalloc_ps.type = emitter_type_title;
      header_ndalloc_ps.field_3.str_val = "(#/sec)";
      col_nrequests.link.qre_next = &col_nrequests;
      col_nrequests.link.qre_prev = &col_nrequests;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_nrequests.link.qre_prev = (peVar34->link).qre_prev;
        col_nrequests.link.qre_next = peVar34;
        ((col_nrequests.link.qre_prev)->link).qre_next = &col_nrequests;
        (peVar34->link).qre_prev = &col_nrequests;
      }
      peVar34 = col_nrequests.link.qre_next;
      col_nrequests.justify = emitter_justify_right;
      col_nrequests.width = 0xd;
      col_nrequests.type = emitter_type_uint64;
      header_nrequests.link.qre_next = &header_nrequests;
      header_nrequests.link.qre_prev = &header_nrequests;
      if (header_ndalloc_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_nrequests.link.qre_prev = ((header_ndalloc_ps.link.qre_next)->link).qre_prev;
        header_nrequests.link.qre_next = header_ndalloc_ps.link.qre_next;
        ((header_nrequests.link.qre_prev)->link).qre_next = &header_nrequests;
        ((header_ndalloc_ps.link.qre_next)->link).qre_prev = &header_nrequests;
      }
      header_nrequests.justify = emitter_justify_right;
      header_nrequests.width = 0xd;
      header_nrequests.type = emitter_type_title;
      header_nrequests.field_3.str_val = "nrequests";
      col_nrequests_ps.link.qre_next = &col_nrequests_ps;
      col_nrequests_ps.link.qre_prev = &col_nrequests_ps;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_nrequests_ps.link.qre_prev = (peVar34->link).qre_prev;
        col_nrequests_ps.link.qre_next = peVar34;
        ((col_nrequests_ps.link.qre_prev)->link).qre_next = &col_nrequests_ps;
        (peVar34->link).qre_prev = &col_nrequests_ps;
      }
      peVar34 = col_nrequests_ps.link.qre_next;
      col_nrequests_ps.justify = emitter_justify_right;
      col_nrequests_ps.width = 10;
      col_nrequests_ps.type = emitter_type_uint64;
      header_nrequests_ps.link.qre_next = &header_nrequests_ps;
      header_nrequests_ps.link.qre_prev = &header_nrequests_ps;
      if (header_nrequests.link.qre_next != (emitter_col_t *)0x0) {
        header_nrequests_ps.link.qre_prev = ((header_nrequests.link.qre_next)->link).qre_prev;
        header_nrequests_ps.link.qre_next = header_nrequests.link.qre_next;
        ((header_nrequests_ps.link.qre_prev)->link).qre_next = &header_nrequests_ps;
        ((header_nrequests.link.qre_next)->link).qre_prev = &header_nrequests_ps;
      }
      peVar33 = header_nrequests_ps.link.qre_next;
      header_nrequests_ps.justify = emitter_justify_right;
      header_nrequests_ps.width = 10;
      header_nrequests_ps.type = emitter_type_title;
      header_nrequests_ps.field_3.str_val = "(#/sec)";
      col_nshards.link.qre_next = &col_nshards;
      col_nshards.link.qre_prev = &col_nshards;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_nshards.link.qre_prev = (peVar34->link).qre_prev;
        col_nshards.link.qre_next = peVar34;
        ((col_nshards.link.qre_prev)->link).qre_next = &col_nshards;
        (peVar34->link).qre_prev = &col_nshards;
      }
      peVar34 = col_nshards.link.qre_next;
      col_nshards.justify = emitter_justify_right;
      col_nshards.width = 9;
      col_nshards.type = emitter_type_unsigned;
      header_nshards.link.qre_next = &header_nshards;
      header_nshards.link.qre_prev = &header_nshards;
      if (peVar33 != (emitter_col_t *)0x0) {
        header_nshards.link.qre_prev = (peVar33->link).qre_prev;
        header_nshards.link.qre_next = peVar33;
        ((header_nshards.link.qre_prev)->link).qre_next = &header_nshards;
        (peVar33->link).qre_prev = &header_nshards;
      }
      header_nshards.justify = emitter_justify_right;
      header_nshards.width = 9;
      header_nshards.type = emitter_type_title;
      header_nshards.field_3.str_val = "nshards";
      col_curregs.link.qre_next = &col_curregs;
      col_curregs.link.qre_prev = &col_curregs;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_curregs.link.qre_prev = (peVar34->link).qre_prev;
        col_curregs.link.qre_next = peVar34;
        ((col_curregs.link.qre_prev)->link).qre_next = &col_curregs;
        (peVar34->link).qre_prev = &col_curregs;
      }
      peVar34 = col_curregs.link.qre_next;
      col_curregs.justify = emitter_justify_right;
      col_curregs.width = 0xd;
      col_curregs.type = emitter_type_size;
      header_curregs.link.qre_next = &header_curregs;
      header_curregs.link.qre_prev = &header_curregs;
      if (header_nshards.link.qre_next != (emitter_col_t *)0x0) {
        header_curregs.link.qre_prev = ((header_nshards.link.qre_next)->link).qre_prev;
        header_curregs.link.qre_next = header_nshards.link.qre_next;
        ((header_curregs.link.qre_prev)->link).qre_next = &header_curregs;
        ((header_nshards.link.qre_next)->link).qre_prev = &header_curregs;
      }
      peVar33 = header_curregs.link.qre_next;
      header_curregs.justify = emitter_justify_right;
      header_curregs.width = 0xd;
      header_curregs.type = emitter_type_title;
      header_curregs.field_3.str_val = "curregs";
      col_curslabs.link.qre_next = &col_curslabs;
      col_curslabs.link.qre_prev = &col_curslabs;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_curslabs.link.qre_prev = (peVar34->link).qre_prev;
        col_curslabs.link.qre_next = peVar34;
        ((col_curslabs.link.qre_prev)->link).qre_next = &col_curslabs;
        (peVar34->link).qre_prev = &col_curslabs;
      }
      peVar34 = col_curslabs.link.qre_next;
      col_curslabs.justify = emitter_justify_right;
      col_curslabs.width = 0xd;
      col_curslabs.type = emitter_type_size;
      header_curslabs.link.qre_next = &header_curslabs;
      header_curslabs.link.qre_prev = &header_curslabs;
      if (peVar33 != (emitter_col_t *)0x0) {
        header_curslabs.link.qre_prev = (peVar33->link).qre_prev;
        header_curslabs.link.qre_next = peVar33;
        ((header_curslabs.link.qre_prev)->link).qre_next = &header_curslabs;
        (peVar33->link).qre_prev = &header_curslabs;
      }
      peVar33 = header_curslabs.link.qre_next;
      header_curslabs.justify = emitter_justify_right;
      header_curslabs.width = 0xd;
      header_curslabs.type = emitter_type_title;
      header_curslabs.field_3.str_val = "curslabs";
      col_nonfull_slabs.link.qre_next = &col_nonfull_slabs;
      col_nonfull_slabs.link.qre_prev = &col_nonfull_slabs;
      if (peVar34 != (emitter_col_t *)0x0) {
        col_nonfull_slabs.link.qre_prev = (peVar34->link).qre_prev;
        col_nonfull_slabs.link.qre_next = peVar34;
        ((col_nonfull_slabs.link.qre_prev)->link).qre_next = &col_nonfull_slabs;
        (peVar34->link).qre_prev = &col_nonfull_slabs;
      }
      col_nonfull_slabs.justify = emitter_justify_right;
      col_nonfull_slabs.width = 0xf;
      col_nonfull_slabs.type = emitter_type_size;
      header_nonfull_slabs.link.qre_next = &header_nonfull_slabs;
      header_nonfull_slabs.link.qre_prev = &header_nonfull_slabs;
      if (peVar33 != (emitter_col_t *)0x0) {
        header_nonfull_slabs.link.qre_prev = (peVar33->link).qre_prev;
        header_nonfull_slabs.link.qre_next = peVar33;
        ((header_nonfull_slabs.link.qre_prev)->link).qre_next = &header_nonfull_slabs;
        (peVar33->link).qre_prev = &header_nonfull_slabs;
      }
      peVar34 = header_nonfull_slabs.link.qre_next;
      header_nonfull_slabs.justify = emitter_justify_right;
      header_nonfull_slabs.width = 0xf;
      header_nonfull_slabs.type = emitter_type_title;
      header_nonfull_slabs.field_3.str_val = "nonfull_slabs";
      col_regs.link.qre_next = &col_regs;
      col_regs.link.qre_prev = &col_regs;
      if (col_nonfull_slabs.link.qre_next != (emitter_col_t *)0x0) {
        col_regs.link.qre_prev = ((col_nonfull_slabs.link.qre_next)->link).qre_prev;
        col_regs.link.qre_next = col_nonfull_slabs.link.qre_next;
        ((col_regs.link.qre_prev)->link).qre_next = &col_regs;
        ((col_nonfull_slabs.link.qre_next)->link).qre_prev = &col_regs;
      }
      col_regs.justify = emitter_justify_right;
      col_regs.width = 5;
      col_regs.type = emitter_type_unsigned;
      header_regs.link.qre_next = &header_regs;
      header_regs.link.qre_prev = &header_regs;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_regs.link.qre_prev = (peVar34->link).qre_prev;
        header_regs.link.qre_next = peVar34;
        ((header_regs.link.qre_prev)->link).qre_next = &header_regs;
        (peVar34->link).qre_prev = &header_regs;
      }
      peVar34 = header_regs.link.qre_next;
      header_regs.justify = emitter_justify_right;
      header_regs.width = 5;
      header_regs.type = emitter_type_title;
      header_regs.field_3.str_val = "regs";
      col_pgs.link.qre_next = &col_pgs;
      col_pgs.link.qre_prev = &col_pgs;
      if (col_regs.link.qre_next != (emitter_col_t *)0x0) {
        col_pgs.link.qre_prev = ((col_regs.link.qre_next)->link).qre_prev;
        col_pgs.link.qre_next = col_regs.link.qre_next;
        ((col_pgs.link.qre_prev)->link).qre_next = &col_pgs;
        ((col_regs.link.qre_next)->link).qre_prev = &col_pgs;
      }
      peVar33 = col_pgs.link.qre_next;
      col_pgs.justify = emitter_justify_right;
      col_pgs.width = 4;
      col_pgs.type = emitter_type_size;
      header_pgs.link.qre_next = &header_pgs;
      header_pgs.link.qre_prev = &header_pgs;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_pgs.link.qre_prev = (peVar34->link).qre_prev;
        header_pgs.link.qre_next = peVar34;
        ((header_pgs.link.qre_prev)->link).qre_next = &header_pgs;
        (peVar34->link).qre_prev = &header_pgs;
      }
      peVar34 = header_pgs.link.qre_next;
      header_pgs.justify = emitter_justify_right;
      header_pgs.width = 4;
      header_pgs.type = emitter_type_title;
      header_pgs.field_3.str_val = "pgs";
      col_justify_spacer.link.qre_next = &col_justify_spacer;
      col_justify_spacer.link.qre_prev = &col_justify_spacer;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_justify_spacer.link.qre_prev = (peVar33->link).qre_prev;
        col_justify_spacer.link.qre_next = peVar33;
        ((col_justify_spacer.link.qre_prev)->link).qre_next = &col_justify_spacer;
        (peVar33->link).qre_prev = &col_justify_spacer;
      }
      peVar33 = col_justify_spacer.link.qre_next;
      col_justify_spacer.justify = emitter_justify_right;
      col_justify_spacer.width = 1;
      col_justify_spacer.type = emitter_type_title;
      header_justify_spacer.link.qre_next = &header_justify_spacer;
      header_justify_spacer.link.qre_prev = &header_justify_spacer;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_justify_spacer.link.qre_prev = (peVar34->link).qre_prev;
        header_justify_spacer.link.qre_next = peVar34;
        ((header_justify_spacer.link.qre_prev)->link).qre_next = &header_justify_spacer;
        (peVar34->link).qre_prev = &header_justify_spacer;
      }
      peVar34 = header_justify_spacer.link.qre_next;
      header_justify_spacer.justify = emitter_justify_right;
      header_justify_spacer.width = 1;
      header_justify_spacer.type = emitter_type_title;
      col_util.link.qre_next = &col_util;
      col_util.link.qre_prev = &col_util;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_util.link.qre_prev = (peVar33->link).qre_prev;
        col_util.link.qre_next = peVar33;
        ((col_util.link.qre_prev)->link).qre_next = &col_util;
        (peVar33->link).qre_prev = &col_util;
      }
      peVar33 = col_util.link.qre_next;
      col_util.justify = emitter_justify_right;
      col_util.width = 6;
      col_util.type = emitter_type_title;
      header_util.link.qre_next = &header_util;
      header_util.link.qre_prev = &header_util;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_util.link.qre_prev = (peVar34->link).qre_prev;
        header_util.link.qre_next = peVar34;
        ((header_util.link.qre_prev)->link).qre_next = &header_util;
        (peVar34->link).qre_prev = &header_util;
      }
      peVar34 = header_util.link.qre_next;
      header_util.justify = emitter_justify_right;
      header_util.width = 6;
      header_util.type = emitter_type_title;
      header_util.field_3.str_val = "util";
      col_nfills.link.qre_next = &col_nfills;
      col_nfills.link.qre_prev = &col_nfills;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nfills.link.qre_prev = (peVar33->link).qre_prev;
        col_nfills.link.qre_next = peVar33;
        ((col_nfills.link.qre_prev)->link).qre_next = &col_nfills;
        (peVar33->link).qre_prev = &col_nfills;
      }
      peVar33 = col_nfills.link.qre_next;
      col_nfills.justify = emitter_justify_right;
      col_nfills.width = 0xd;
      col_nfills.type = emitter_type_uint64;
      header_nfills.link.qre_next = &header_nfills;
      header_nfills.link.qre_prev = &header_nfills;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nfills.link.qre_prev = (peVar34->link).qre_prev;
        header_nfills.link.qre_next = peVar34;
        ((header_nfills.link.qre_prev)->link).qre_next = &header_nfills;
        (peVar34->link).qre_prev = &header_nfills;
      }
      peVar34 = header_nfills.link.qre_next;
      header_nfills.justify = emitter_justify_right;
      header_nfills.width = 0xd;
      header_nfills.type = emitter_type_title;
      header_nfills.field_3.str_val = "nfills";
      col_nfills_ps.link.qre_next = &col_nfills_ps;
      col_nfills_ps.link.qre_prev = &col_nfills_ps;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nfills_ps.link.qre_prev = (peVar33->link).qre_prev;
        col_nfills_ps.link.qre_next = peVar33;
        ((col_nfills_ps.link.qre_prev)->link).qre_next = &col_nfills_ps;
        (peVar33->link).qre_prev = &col_nfills_ps;
      }
      peVar33 = col_nfills_ps.link.qre_next;
      col_nfills_ps.justify = emitter_justify_right;
      col_nfills_ps.width = 8;
      col_nfills_ps.type = emitter_type_uint64;
      header_nfills_ps.link.qre_next = &header_nfills_ps;
      header_nfills_ps.link.qre_prev = &header_nfills_ps;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nfills_ps.link.qre_prev = (peVar34->link).qre_prev;
        header_nfills_ps.link.qre_next = peVar34;
        ((header_nfills_ps.link.qre_prev)->link).qre_next = &header_nfills_ps;
        (peVar34->link).qre_prev = &header_nfills_ps;
      }
      peVar34 = header_nfills_ps.link.qre_next;
      header_nfills_ps.justify = emitter_justify_right;
      header_nfills_ps.width = 8;
      header_nfills_ps.type = emitter_type_title;
      header_nfills_ps.field_3.str_val = "(#/sec)";
      col_nflushes.link.qre_next = &col_nflushes;
      col_nflushes.link.qre_prev = &col_nflushes;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nflushes.link.qre_prev = (peVar33->link).qre_prev;
        col_nflushes.link.qre_next = peVar33;
        ((col_nflushes.link.qre_prev)->link).qre_next = &col_nflushes;
        (peVar33->link).qre_prev = &col_nflushes;
      }
      peVar33 = col_nflushes.link.qre_next;
      col_nflushes.justify = emitter_justify_right;
      col_nflushes.width = 0xd;
      col_nflushes.type = emitter_type_uint64;
      header_nflushes.link.qre_next = &header_nflushes;
      header_nflushes.link.qre_prev = &header_nflushes;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nflushes.link.qre_prev = (peVar34->link).qre_prev;
        header_nflushes.link.qre_next = peVar34;
        ((header_nflushes.link.qre_prev)->link).qre_next = &header_nflushes;
        (peVar34->link).qre_prev = &header_nflushes;
      }
      peVar34 = header_nflushes.link.qre_next;
      header_nflushes.justify = emitter_justify_right;
      header_nflushes.width = 0xd;
      header_nflushes.type = emitter_type_title;
      header_nflushes.field_3.str_val = "nflushes";
      col_nflushes_ps.link.qre_next = &col_nflushes_ps;
      col_nflushes_ps.link.qre_prev = &col_nflushes_ps;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nflushes_ps.link.qre_prev = (peVar33->link).qre_prev;
        col_nflushes_ps.link.qre_next = peVar33;
        ((col_nflushes_ps.link.qre_prev)->link).qre_next = &col_nflushes_ps;
        (peVar33->link).qre_prev = &col_nflushes_ps;
      }
      peVar33 = col_nflushes_ps.link.qre_next;
      col_nflushes_ps.justify = emitter_justify_right;
      col_nflushes_ps.width = 8;
      col_nflushes_ps.type = emitter_type_uint64;
      header_nflushes_ps.link.qre_next = &header_nflushes_ps;
      header_nflushes_ps.link.qre_prev = &header_nflushes_ps;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nflushes_ps.link.qre_prev = (peVar34->link).qre_prev;
        header_nflushes_ps.link.qre_next = peVar34;
        ((header_nflushes_ps.link.qre_prev)->link).qre_next = &header_nflushes_ps;
        (peVar34->link).qre_prev = &header_nflushes_ps;
      }
      peVar34 = header_nflushes_ps.link.qre_next;
      header_nflushes_ps.justify = emitter_justify_right;
      header_nflushes_ps.width = 8;
      header_nflushes_ps.type = emitter_type_title;
      header_nflushes_ps.field_3.str_val = "(#/sec)";
      col_nslabs.link.qre_next = &col_nslabs;
      col_nslabs.link.qre_prev = &col_nslabs;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nslabs.link.qre_prev = (peVar33->link).qre_prev;
        col_nslabs.link.qre_next = peVar33;
        ((col_nslabs.link.qre_prev)->link).qre_next = &col_nslabs;
        (peVar33->link).qre_prev = &col_nslabs;
      }
      peVar33 = col_nslabs.link.qre_next;
      col_nslabs.justify = emitter_justify_right;
      col_nslabs.width = 0xd;
      col_nslabs.type = emitter_type_uint64;
      header_nslabs.link.qre_next = &header_nslabs;
      header_nslabs.link.qre_prev = &header_nslabs;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nslabs.link.qre_prev = (peVar34->link).qre_prev;
        header_nslabs.link.qre_next = peVar34;
        ((header_nslabs.link.qre_prev)->link).qre_next = &header_nslabs;
        (peVar34->link).qre_prev = &header_nslabs;
      }
      peVar34 = header_nslabs.link.qre_next;
      header_nslabs.justify = emitter_justify_right;
      header_nslabs.width = 0xd;
      header_nslabs.type = emitter_type_title;
      header_nslabs.field_3.str_val = "nslabs";
      col_nreslabs.link.qre_next = &col_nreslabs;
      col_nreslabs.link.qre_prev = &col_nreslabs;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nreslabs.link.qre_prev = (peVar33->link).qre_prev;
        col_nreslabs.link.qre_next = peVar33;
        ((col_nreslabs.link.qre_prev)->link).qre_next = &col_nreslabs;
        (peVar33->link).qre_prev = &col_nreslabs;
      }
      peVar33 = col_nreslabs.link.qre_next;
      col_nreslabs.justify = emitter_justify_right;
      col_nreslabs.width = 0xd;
      col_nreslabs.type = emitter_type_uint64;
      header_nreslabs.link.qre_next = &header_nreslabs;
      header_nreslabs.link.qre_prev = &header_nreslabs;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nreslabs.link.qre_prev = (peVar34->link).qre_prev;
        header_nreslabs.link.qre_next = peVar34;
        ((header_nreslabs.link.qre_prev)->link).qre_next = &header_nreslabs;
        (peVar34->link).qre_prev = &header_nreslabs;
      }
      peVar34 = header_nreslabs.link.qre_next;
      header_nreslabs.justify = emitter_justify_right;
      header_nreslabs.width = 0xd;
      header_nreslabs.type = emitter_type_title;
      header_nreslabs.field_3.str_val = "nreslabs";
      col_nreslabs_ps.link.qre_next = &col_nreslabs_ps;
      col_nreslabs_ps.link.qre_prev = &col_nreslabs_ps;
      if (peVar33 != (emitter_col_t *)0x0) {
        col_nreslabs_ps.link.qre_prev = (peVar33->link).qre_prev;
        col_nreslabs_ps.link.qre_next = peVar33;
        ((col_nreslabs_ps.link.qre_prev)->link).qre_next = &col_nreslabs_ps;
        (peVar33->link).qre_prev = &col_nreslabs_ps;
      }
      row_1.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)col_nreslabs_ps.link.qre_next;
      col_nreslabs_ps.justify = emitter_justify_right;
      col_nreslabs_ps.width = 8;
      col_nreslabs_ps.type = emitter_type_uint64;
      header_nreslabs_ps.link.qre_next = &header_nreslabs_ps;
      header_nreslabs_ps.link.qre_prev = &header_nreslabs_ps;
      if (peVar34 != (emitter_col_t *)0x0) {
        header_nreslabs_ps.link.qre_prev = (peVar34->link).qre_prev;
        header_nreslabs_ps.link.qre_next = peVar34;
        ((header_nreslabs_ps.link.qre_prev)->link).qre_next = &header_nreslabs_ps;
        (peVar34->link).qre_prev = &header_nreslabs_ps;
      }
      header_row.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)header_nreslabs_ps.link.qre_next;
      header_nreslabs_ps.justify = emitter_justify_right;
      header_nreslabs_ps.width = 8;
      header_nreslabs_ps.type = emitter_type_title;
      header_nreslabs_ps.field_3.str_val = "(#/sec)";
      header_justify_spacer.field_3.str_val = " ";
      col_justify_spacer.field_3.str_val = " ";
      if ((char)local_1080 != '\0') {
        mutex_stats_init_cols
                  (&row_1,(char *)0x0,(emitter_col_t *)0x0,(emitter_col_t *)&sz,col_mutex32);
        mutex_stats_init_cols
                  (&header_row,(char *)0x0,(emitter_col_t *)0x0,(emitter_col_t *)&miblen,
                   header_mutex32);
      }
      peVar26 = local_1140;
      miblen_34 = CONCAT44(miblen_34._4_4_ + -5,(undefined4)miblen_34);
      emitter_table_printf(local_1140,"bins:");
      eVar35 = header_row;
      if (peVar26->output == emitter_output_table) {
        if (header_row.cols.qlh_first != (emitter_col_t *)0x0) {
          eVar36 = header_row;
          do {
            emitter_print_value(peVar26,((emitter_col_t *)eVar36.cols.qlh_first)->justify,
                                ((emitter_col_t *)eVar36.cols.qlh_first)->width,
                                ((emitter_col_t *)eVar36.cols.qlh_first)->type,
                                &((emitter_col_t *)eVar36.cols.qlh_first)->field_3);
            eVar36.cols.qlh_first =
                 (anon_struct_8_1_803fbc3e_for_cols)
                 (((emitter_col_t *)eVar36.cols.qlh_first)->link).qre_next;
            if (eVar36.cols.qlh_first == eVar35.cols.qlh_first) {
              eVar36.cols.qlh_first =
                   (anon_struct_8_1_803fbc3e_for_cols)
                   (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
            }
          } while (eVar36.cols.qlh_first != (emitter_col_t *)0x0);
        }
        emitter_table_printf(peVar26,"\n");
        aVar25 = local_1148;
      }
      emitter_json_array_kv_begin(peVar26,"bins");
      if (nbins == 0) {
        bVar39 = false;
      }
      else {
        uptime_s_5 = uVar23 / 1000000000;
        aVar37.uint64_val = 0;
        bVar17 = false;
        do {
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nslabs",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nslabs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nslabs,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          bVar39 = nslabs == 0;
          if (bVar17 == true && !bVar39) {
            emitter_table_printf(local_1140,"                     ---\n");
          }
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("arenas.bin.0.size",&sz_1,(size_t *)&col_name);
          uVar29 = uptime_s_5;
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "arenas.bin.0.size";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&reg_size,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 4;
          iVar20 = je_mallctlnametomib("arenas.bin.0.nregs",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "arenas.bin.0.nregs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nregs,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("arenas.bin.0.slab_size",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "arenas.bin.0.slab_size";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&slab_size,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 4;
          iVar20 = je_mallctlnametomib("arenas.bin.0.nshards",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "arenas.bin.0.nshards";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nshards,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nmalloc",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nmalloc";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nmalloc,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.ndalloc",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.ndalloc";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&ndalloc,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.curregs",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.curregs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&curregs,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nrequests",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nrequests";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nrequests,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nfills",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nfills";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nfills,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nflushes",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nflushes";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nflushes,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nreslabs",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nreslabs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nreslabs,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.curslabs",&sz_1,(size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.curslabs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&curslabs,&sz_43,(void *)0x0,0);
          if (iVar20 != 0) goto LAB_0014a0e4;
          col_name.justify = 7;
          col_name.width = 0;
          sz_43 = 8;
          iVar20 = je_mallctlnametomib("stats.arenas.0.bins.0.nonfull_slabs",&sz_1,
                                       (size_t *)&col_name);
          if (iVar20 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = "stats.arenas.0.bins.0.nonfull_slabs";
            goto LAB_0014a2d8;
          }
          local_10f8 = aVar25;
          local_10e8 = aVar37;
          iVar20 = je_mallctlbymib(&sz_1,col_name._0_8_,&nonfull_slabs,&sz_43,(void *)0x0,0);
          peVar26 = local_1140;
          if (iVar20 != 0) goto LAB_0014a0e4;
          if ((char)local_1080 != '\0') {
            local_c10 = emitter_type_uint64;
            malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
            sz_43 = 7;
            sz_57 = 8;
            iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
            if (iVar20 == 0) {
              col_name.field_3 = aVar25;
              col_name.link.qre_prev = (emitter_col_t *)aVar37;
              iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_c08,&sz_57,(void *)0x0,0);
              if (iVar20 != 0) goto LAB_0014a0e4;
              local_be8 = 4;
              local_be0 = local_c08[0];
              if (uVar23 == 0) {
                local_be0.uint64_val = 0;
              }
              if ((emitter_col_t *)local_c08[0].uint64_val != (emitter_col_t *)0x0 &&
                  999999999 < uVar23) {
                local_be0.uint64_val = local_c08[0].uint64_val / uVar29;
              }
              local_bc0 = 4;
              malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
              sz_43 = 7;
              sz_57 = 8;
              iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
              if (iVar20 == 0) {
                col_name.field_3 = aVar25;
                col_name.link.qre_prev = (emitter_col_t *)aVar37;
                iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_bb8,&sz_57,(void *)0x0,0);
                if (iVar20 != 0) goto LAB_0014a0e4;
                local_b98 = 4;
                local_b90 = local_bb8[0];
                if (uVar23 == 0) {
                  local_b90 = 0;
                }
                if (local_bb8[0] != 0 && 999999999 < uVar23) {
                  local_b90 = local_bb8[0] / uVar29;
                }
                local_b70 = 4;
                malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
                sz_43 = 7;
                sz_57 = 8;
                iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                if (iVar20 == 0) {
                  col_name.field_3 = aVar25;
                  col_name.link.qre_prev = (emitter_col_t *)aVar37;
                  iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_b68,&sz_57,(void *)0x0,0)
                  ;
                  if (iVar20 != 0) goto LAB_0014a0e4;
                  local_b48 = 4;
                  local_b40 = local_b68[0];
                  if (uVar23 == 0) {
                    local_b40 = 0;
                  }
                  if (local_b68[0] != 0 && 999999999 < uVar23) {
                    local_b40 = local_b68[0] / uVar29;
                  }
                  local_b20 = 4;
                  malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
                  sz_43 = 7;
                  sz_57 = 8;
                  iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                  if (iVar20 == 0) {
                    col_name.field_3 = aVar25;
                    col_name.link.qre_prev = (emitter_col_t *)aVar37;
                    iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_b18,&sz_57,(void *)0x0,
                                             0);
                    if (iVar20 != 0) goto LAB_0014a0e4;
                    local_af8 = 4;
                    local_af0 = local_b18[0];
                    if (uVar23 == 0) {
                      local_af0 = 0;
                    }
                    if (local_b18[0] != 0 && 999999999 < uVar23) {
                      local_af0 = local_b18[0] / uVar29;
                    }
                    local_ad0 = 4;
                    malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
                    sz_43 = 7;
                    sz_57 = 8;
                    iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                    if (iVar20 == 0) {
                      col_name.field_3 = aVar25;
                      col_name.link.qre_prev = (emitter_col_t *)aVar37;
                      iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_ac8,&sz_57,
                                               (void *)0x0,0);
                      if (iVar20 != 0) goto LAB_0014a0e4;
                      local_aa8 = 4;
                      local_aa0 = local_ac8[0];
                      if (uVar23 == 0) {
                        local_aa0 = 0;
                      }
                      if (local_ac8[0] != 0 && 999999999 < uVar23) {
                        local_aa0 = local_ac8[0] / uVar29;
                      }
                      local_a80 = 4;
                      malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
                      sz_43 = 7;
                      sz_57 = 8;
                      iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                      if (iVar20 == 0) {
                        col_name.field_3 = aVar25;
                        col_name.link.qre_prev = (emitter_col_t *)aVar37;
                        iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,local_a78,&sz_57,
                                                 (void *)0x0,0);
                        if (iVar20 != 0) goto LAB_0014a0e4;
                        col_mutex32[0].type = emitter_type_uint32;
                        malloc_snprintf((char *)&sz_1,0x80,"stats.%s.%s.%s","arenas.0.bins.0");
                        sz_43 = 7;
                        sz_57 = 4;
                        iVar20 = je_mallctlnametomib((char *)&sz_1,(size_t *)&col_name,&sz_43);
                        if (iVar20 == 0) {
                          col_name.field_3 = aVar25;
                          col_name.link.qre_prev = (emitter_col_t *)aVar37;
                          iVar20 = je_mallctlbymib((size_t *)&col_name,sz_43,&col_mutex32[0].field_3
                                                   ,&sz_57,(void *)0x0,0);
                          peVar26 = local_1140;
                          if (iVar20 == 0) {
                            if (local_1140->output == emitter_output_json) {
                              if (local_1140->emitted_key == true) {
                                local_1140->emitted_key = false;
                              }
                              else {
                                pcVar32 = "";
                                if (local_1140->item_at_depth != false) {
                                  pcVar32 = ",";
                                }
                                emitter_printf(local_1140,"%s\n",pcVar32);
                                pcVar32 = "\t";
                                if (peVar26->output != emitter_output_json) {
                                  pcVar32 = " ";
                                }
                                if (0 < peVar26->nesting_depth) {
                                  iVar20 = peVar26->nesting_depth <<
                                           (peVar26->output != emitter_output_json);
                                  if (iVar20 < 2) {
                                    iVar20 = 1;
                                  }
                                  do {
                                    emitter_printf(peVar26,"%s",pcVar32);
                                    iVar20 = iVar20 + -1;
                                  } while (iVar20 != 0);
                                }
                              }
                              emitter_printf(peVar26,"{");
                              peVar26->nesting_depth = peVar26->nesting_depth + 1;
                              peVar26->item_at_depth = false;
                              aVar25 = local_1148;
                              uVar29 = uptime_s_5;
                            }
                            emitter_json_kv(peVar26,"nmalloc",emitter_type_uint64,&nmalloc);
                            emitter_json_kv(peVar26,"ndalloc",emitter_type_uint64,&ndalloc);
                            emitter_json_kv(peVar26,"curregs",emitter_type_size,&curregs);
                            emitter_json_kv(peVar26,"nrequests",emitter_type_uint64,&nrequests);
                            emitter_json_kv(peVar26,"nfills",emitter_type_uint64,&nfills);
                            emitter_json_kv(peVar26,"nflushes",emitter_type_uint64,&nflushes);
                            emitter_json_kv(peVar26,"nreslabs",emitter_type_uint64,&nreslabs);
                            emitter_json_kv(peVar26,"curslabs",emitter_type_size,&curslabs);
                            emitter_json_kv(peVar26,"nonfull_slabs",emitter_type_size,&nonfull_slabs
                                           );
                            emitter_json_object_kv_begin(peVar26,"mutex");
                            mutex_stats_emit(peVar26,(emitter_row_t *)0x0,(emitter_col_t *)&sz,
                                             col_mutex32);
                            if (peVar26->output == emitter_output_json) {
                              peVar26->nesting_depth = peVar26->nesting_depth + -1;
                              peVar26->item_at_depth = true;
                              emitter_printf(peVar26,"\n");
                              pcVar32 = "\t";
                              if (peVar26->output != emitter_output_json) {
                                pcVar32 = " ";
                              }
                              if (0 < peVar26->nesting_depth) {
                                iVar20 = peVar26->nesting_depth <<
                                         (peVar26->output != emitter_output_json);
                                if (iVar20 < 2) {
                                  iVar20 = 1;
                                }
                                do {
                                  emitter_printf(peVar26,"%s",pcVar32);
                                  iVar20 = iVar20 + -1;
                                } while (iVar20 != 0);
                              }
                              emitter_printf(peVar26,"}");
                              aVar25 = local_1148;
                              uVar29 = uptime_s_5;
                            }
                            goto LAB_001482b8;
                          }
                          goto LAB_0014a0e4;
                        }
                      }
                    }
                  }
                }
              }
            }
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar32 = (char *)&sz_1;
            goto LAB_0014a2d8;
          }
          if (local_1140->output == emitter_output_json) {
            if (local_1140->emitted_key == true) {
              local_1140->emitted_key = false;
            }
            else {
              pcVar32 = "";
              if (local_1140->item_at_depth != false) {
                pcVar32 = ",";
              }
              emitter_printf(local_1140,"%s\n",pcVar32);
              pcVar32 = "\t";
              if (peVar26->output != emitter_output_json) {
                pcVar32 = " ";
              }
              if (0 < peVar26->nesting_depth) {
                iVar20 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
                if (iVar20 < 2) {
                  iVar20 = 1;
                }
                do {
                  emitter_printf(peVar26,"%s",pcVar32);
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
            }
            emitter_printf(peVar26,"{");
            peVar26->nesting_depth = peVar26->nesting_depth + 1;
            peVar26->item_at_depth = false;
            aVar25 = local_1148;
            uVar29 = uptime_s_5;
          }
          emitter_json_kv(peVar26,"nmalloc",emitter_type_uint64,&nmalloc);
          emitter_json_kv(peVar26,"ndalloc",emitter_type_uint64,&ndalloc);
          emitter_json_kv(peVar26,"curregs",emitter_type_size,&curregs);
          emitter_json_kv(peVar26,"nrequests",emitter_type_uint64,&nrequests);
          emitter_json_kv(peVar26,"nfills",emitter_type_uint64,&nfills);
          emitter_json_kv(peVar26,"nflushes",emitter_type_uint64,&nflushes);
          emitter_json_kv(peVar26,"nreslabs",emitter_type_uint64,&nreslabs);
          emitter_json_kv(peVar26,"curslabs",emitter_type_size,&curslabs);
          emitter_json_kv(peVar26,"nonfull_slabs",emitter_type_size,&nonfull_slabs);
LAB_001482b8:
          peVar18 = local_1140;
          if (peVar26->output == emitter_output_json) {
            local_1140->nesting_depth = local_1140->nesting_depth + -1;
            local_1140->item_at_depth = true;
            emitter_printf(local_1140,"\n");
            pcVar32 = "\t";
            if (peVar18->output != emitter_output_json) {
              pcVar32 = " ";
            }
            if (0 < peVar18->nesting_depth) {
              iVar20 = peVar18->nesting_depth << (peVar18->output != emitter_output_json);
              if (iVar20 < 2) {
                iVar20 = 1;
              }
              do {
                emitter_printf(peVar18,"%s",pcVar32);
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            emitter_printf(peVar18,"}");
            aVar25 = local_1148;
            uVar29 = uptime_s_5;
          }
          uVar24 = nregs * curslabs;
          if (uVar24 < curregs || uVar24 == 0) {
            if (uVar24 == 0) {
LAB_001483f5:
              pcVar32 = "1";
            }
            else {
              pcVar32 = " race";
            }
            malloc_snprintf((char *)&sz_1,6,pcVar32);
          }
          else {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar24;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = curregs * 1000;
            uVar22 = SUB164(auVar16 / auVar2,0);
            if (uVar22 < 10) {
              pcVar32 = "0.00%u";
            }
            else if (uVar22 < 100) {
              pcVar32 = "0.0%u";
            }
            else {
              if (999 < uVar22) goto LAB_001483f5;
              pcVar32 = "0.%u";
            }
            malloc_snprintf((char *)&sz_1,6,pcVar32,SUB168(auVar16 / auVar2,0) & 0xffffffff);
          }
          eVar35.cols.qlh_first = row_1.cols.qlh_first;
          peVar26 = local_1140;
          col_util.field_3.str_val = (char *)&sz_1;
          header_nmalloc_1.field_3.uint64_val = curregs * reg_size;
          col_size.field_3.size_val = reg_size;
          local_d70.int_val = aVar37.int_val;
          col_nmalloc.field_3.uint64_val = nmalloc;
          col_nmalloc_ps.field_3.uint64_val = nmalloc;
          if (uVar23 == 0) {
            col_nmalloc_ps.field_3.uint64_val = 0;
          }
          if (nmalloc != 0 && 999999999 < uVar23) {
            col_nmalloc_ps.field_3.uint64_val = nmalloc / uVar29;
          }
          col_ndalloc.field_3.uint64_val = ndalloc;
          col_ndalloc_ps.field_3.uint64_val = ndalloc;
          if (uVar23 == 0) {
            col_ndalloc_ps.field_3.uint64_val = 0;
          }
          if (ndalloc != 0 && 999999999 < uVar23) {
            col_ndalloc_ps.field_3.uint64_val = ndalloc / uVar29;
          }
          col_nrequests.field_3.uint64_val = nrequests;
          col_nrequests_ps.field_3.uint64_val = nrequests;
          if (uVar23 == 0) {
            col_nrequests_ps.field_3.uint64_val = 0;
          }
          if (nrequests != 0 && 999999999 < uVar23) {
            col_nrequests_ps.field_3.uint64_val = nrequests / uVar29;
          }
          col_pgs.field_3.uint64_val = slab_size / page_1;
          col_nshards.field_3.uint32_val = nshards;
          col_curregs.field_3.size_val = curregs;
          col_curslabs.field_3.size_val = curslabs;
          col_nonfull_slabs.field_3.size_val = nonfull_slabs;
          col_regs.field_3.uint32_val = nregs;
          col_nfills.field_3.uint64_val = nfills;
          col_nfills_ps.field_3.uint64_val = nfills;
          if (uVar23 == 0) {
            col_nfills_ps.field_3.uint64_val = 0;
          }
          if (nfills != 0 && 999999999 < uVar23) {
            col_nfills_ps.field_3.uint64_val = nfills / uVar29;
          }
          col_nflushes.field_3.uint64_val = nflushes;
          col_nflushes_ps.field_3.uint64_val = nflushes;
          if (uVar23 == 0) {
            col_nflushes_ps.field_3.uint64_val = 0;
          }
          if (nflushes != 0 && 999999999 < uVar23) {
            col_nflushes_ps.field_3.uint64_val = nflushes / uVar29;
          }
          col_nslabs.field_3.uint64_val = nslabs;
          col_nreslabs.field_3.uint64_val = nreslabs;
          col_nreslabs_ps.field_3.uint64_val = nreslabs;
          if (uVar23 == 0) {
            col_nreslabs_ps.field_3.uint64_val = 0;
          }
          if (nreslabs != 0 && 999999999 < uVar23) {
            col_nreslabs_ps.field_3.uint64_val = nreslabs / uVar29;
          }
          eVar36.cols.qlh_first = row_1.cols.qlh_first;
          if (local_1140->output == emitter_output_table) {
            while (eVar36.cols.qlh_first != (emitter_col_t *)0x0) {
              emitter_print_value(peVar26,((emitter_col_t *)eVar36.cols.qlh_first)->justify,
                                  ((emitter_col_t *)eVar36.cols.qlh_first)->width,
                                  ((emitter_col_t *)eVar36.cols.qlh_first)->type,
                                  &((emitter_col_t *)eVar36.cols.qlh_first)->field_3);
              aVar1.qlh_first = (((emitter_col_t *)eVar36.cols.qlh_first)->link).qre_next;
              eVar36.cols.qlh_first =
                   (anon_struct_8_1_803fbc3e_for_cols)
                   (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
              if ((anon_struct_8_1_803fbc3e_for_cols)aVar1.qlh_first != eVar35.cols.qlh_first) {
                eVar36.cols.qlh_first =
                     (anon_struct_8_1_803fbc3e_for_cols)
                     (anon_struct_8_1_803fbc3e_for_cols)aVar1.qlh_first;
              }
            }
            emitter_table_printf(peVar26,"\n");
            aVar25 = local_1148;
          }
          aVar37.str_val = (char *)(aVar37.uint64_val + 1);
          bVar17 = bVar39;
        } while (aVar37.uint64_val < (emitter_col_t *)(ulong)nbins);
      }
      peVar26 = local_1140;
      if (local_1140->output == emitter_output_json) {
        local_1140->nesting_depth = local_1140->nesting_depth + -1;
        local_1140->item_at_depth = true;
        emitter_printf(local_1140,"\n");
        pcVar32 = "\t";
        if (peVar26->output != emitter_output_json) {
          pcVar32 = " ";
        }
        if (0 < peVar26->nesting_depth) {
          iVar21 = peVar26->nesting_depth << (peVar26->output != emitter_output_json);
          iVar20 = 1;
          if (1 < iVar21) {
            iVar20 = iVar21;
          }
          do {
            emitter_printf(peVar26,"%s",pcVar32);
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
        }
        emitter_printf(peVar26,"]");
        aVar25 = local_1148;
      }
      if (bVar39) {
        emitter_table_printf(peVar26,"                     ---\n");
      }
      goto LAB_0014876f;
    }
  }
  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
  pcVar32 = "arenas.nbins";
LAB_0014a2d8:
  malloc_printf(format,pcVar32);
  abort();
}

Assistant:

static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents) {
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 8, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 8, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
}